

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# curveNi_intersector.h
# Opt level: O3

void embree::avx512::CurveNiIntersectorK<4,8>::
     intersect_hn<embree::avx512::OrientedCurve1IntersectorK<embree::HermiteCurveT,8>,embree::avx512::Intersect1KEpilog1<8,true>>
               (Precalculations *pre,RayHitK<8> *ray,size_t k,RayQueryContext *context,
               Primitive *prim)

{
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar1;
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar2;
  Primitive PVar3;
  uint uVar4;
  uint uVar5;
  Geometry *pGVar6;
  long lVar7;
  __int_type_conflict _Var8;
  RTCFilterFunctionN p_Var9;
  bool bVar10;
  bool bVar11;
  bool bVar12;
  undefined8 uVar13;
  undefined8 uVar14;
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  int iVar19;
  int iVar20;
  int iVar21;
  int iVar22;
  int iVar23;
  int iVar24;
  int iVar25;
  byte bVar26;
  uint uVar27;
  ulong uVar28;
  long lVar30;
  uint uVar31;
  ulong uVar32;
  ulong uVar33;
  uint uVar34;
  bool bVar35;
  bool bVar36;
  bool bVar37;
  bool bVar38;
  ulong uVar39;
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  undefined1 auVar53 [16];
  undefined1 auVar60 [16];
  undefined1 auVar61 [16];
  undefined1 auVar62 [16];
  undefined1 auVar63 [16];
  undefined1 auVar64 [16];
  undefined1 auVar65 [16];
  undefined1 auVar66 [16];
  undefined1 auVar67 [16];
  undefined1 auVar68 [16];
  undefined1 auVar69 [16];
  undefined1 auVar70 [16];
  undefined1 auVar54 [16];
  undefined1 auVar71 [32];
  undefined1 auVar72 [32];
  undefined1 auVar73 [32];
  undefined1 auVar74 [32];
  undefined1 auVar75 [32];
  undefined1 auVar76 [32];
  undefined1 auVar77 [32];
  undefined1 auVar78 [32];
  undefined1 auVar79 [32];
  undefined1 auVar80 [32];
  undefined1 auVar81 [32];
  undefined1 auVar82 [32];
  undefined1 auVar83 [32];
  undefined1 auVar84 [32];
  undefined1 auVar85 [32];
  undefined1 auVar86 [32];
  undefined1 auVar87 [32];
  undefined1 auVar88 [32];
  undefined1 auVar55 [16];
  undefined1 auVar56 [16];
  undefined1 auVar57 [16];
  undefined1 auVar58 [16];
  undefined1 auVar59 [16];
  undefined1 auVar89 [32];
  undefined1 auVar90 [32];
  undefined1 auVar91 [32];
  undefined1 auVar92 [32];
  undefined1 auVar93 [32];
  undefined1 auVar95 [32];
  undefined1 auVar97 [32];
  undefined1 auVar99 [32];
  undefined1 auVar101 [32];
  float fVar103;
  vint4 bi_2;
  undefined1 auVar104 [16];
  undefined1 auVar105 [16];
  undefined1 auVar106 [16];
  undefined1 auVar107 [16];
  undefined1 auVar108 [16];
  float fVar109;
  undefined4 uVar110;
  float fVar116;
  float fVar117;
  vint4 bi_1;
  undefined1 auVar111 [16];
  float fVar118;
  undefined1 auVar112 [16];
  undefined1 auVar113 [16];
  undefined1 auVar114 [16];
  undefined1 auVar115 [16];
  vint4 bi;
  undefined1 auVar119 [16];
  undefined1 auVar120 [16];
  undefined1 auVar121 [16];
  undefined1 auVar122 [16];
  undefined1 auVar123 [16];
  undefined1 auVar124 [16];
  undefined1 auVar125 [16];
  undefined1 auVar126 [16];
  undefined1 auVar127 [32];
  undefined1 auVar128 [16];
  undefined1 auVar129 [16];
  undefined1 auVar130 [16];
  undefined1 auVar131 [16];
  undefined1 auVar132 [16];
  undefined1 auVar133 [16];
  undefined1 auVar134 [16];
  vint4 ai_2;
  undefined1 auVar136 [16];
  undefined1 auVar137 [16];
  undefined1 auVar138 [16];
  undefined1 auVar139 [32];
  vint4 ai;
  undefined1 auVar142 [16];
  undefined1 auVar143 [16];
  undefined1 auVar144 [16];
  undefined1 auVar145 [16];
  undefined1 auVar146 [16];
  undefined1 auVar147 [16];
  undefined1 auVar148 [16];
  undefined1 auVar149 [32];
  vint4 ai_1;
  undefined1 auVar151 [16];
  undefined1 auVar152 [16];
  undefined1 auVar153 [16];
  undefined1 auVar154 [16];
  undefined1 auVar155 [16];
  undefined1 auVar156 [16];
  undefined1 auVar157 [16];
  undefined1 auVar158 [16];
  undefined1 auVar159 [16];
  undefined1 auVar160 [16];
  undefined1 auVar161 [16];
  undefined1 auVar162 [16];
  undefined1 auVar163 [16];
  undefined1 auVar164 [16];
  undefined1 auVar165 [16];
  undefined1 auVar166 [16];
  undefined1 auVar167 [16];
  vfloat4 a0_3;
  undefined1 auVar168 [16];
  undefined1 auVar169 [16];
  undefined1 auVar170 [16];
  undefined1 auVar171 [16];
  undefined1 auVar172 [16];
  undefined1 auVar173 [16];
  undefined1 auVar174 [16];
  undefined1 auVar175 [16];
  undefined1 auVar176 [16];
  undefined1 auVar177 [16];
  undefined1 auVar178 [16];
  undefined1 auVar179 [16];
  __m128 a_1;
  undefined1 auVar180 [16];
  undefined1 auVar181 [16];
  undefined1 auVar182 [16];
  undefined1 auVar183 [16];
  undefined1 auVar184 [16];
  undefined1 auVar185 [16];
  undefined1 auVar186 [16];
  undefined1 auVar187 [16];
  undefined1 auVar188 [16];
  undefined1 auVar189 [16];
  __m128 a;
  undefined1 auVar190 [16];
  undefined1 auVar191 [16];
  undefined1 auVar192 [16];
  undefined1 auVar193 [16];
  undefined1 auVar194 [16];
  undefined1 auVar195 [16];
  undefined1 auVar196 [32];
  float fVar197;
  float fVar206;
  float fVar207;
  undefined1 auVar198 [16];
  undefined1 auVar199 [16];
  undefined1 auVar200 [16];
  undefined1 auVar201 [16];
  undefined1 auVar202 [16];
  undefined1 auVar203 [16];
  undefined1 auVar204 [16];
  undefined1 auVar205 [16];
  float fVar208;
  float fVar209;
  float fVar220;
  float fVar221;
  vfloat4 a0_1;
  undefined1 auVar210 [16];
  float fVar222;
  undefined1 auVar211 [16];
  undefined1 auVar212 [16];
  undefined1 auVar213 [16];
  undefined1 auVar214 [16];
  undefined1 auVar215 [16];
  undefined1 auVar216 [16];
  undefined1 auVar217 [16];
  undefined1 auVar218 [16];
  undefined1 auVar219 [16];
  float fVar223;
  float fVar228;
  float fVar229;
  vfloat4 a0;
  undefined1 auVar224 [16];
  float fVar230;
  undefined1 auVar225 [16];
  undefined1 auVar226 [16];
  undefined1 auVar227 [16];
  undefined1 auVar231 [16];
  undefined1 auVar232 [16];
  undefined1 auVar233 [16];
  undefined1 auVar234 [16];
  undefined1 auVar235 [16];
  undefined1 auVar236 [16];
  undefined1 auVar237 [16];
  undefined1 auVar238 [16];
  undefined1 auVar239 [64];
  undefined1 auVar240 [64];
  undefined1 auVar241 [64];
  undefined1 auVar242 [64];
  undefined1 auVar243 [64];
  undefined1 auVar244 [64];
  undefined1 auVar245 [64];
  undefined1 in_ZMM29 [64];
  undefined1 auVar246 [64];
  undefined1 auVar247 [64];
  vfloat_impl<4> p01;
  vfloat_impl<4> p00;
  RTCFilterFunctionNArguments args;
  vfloat_impl<4> p02;
  uint mask_stack [4];
  vfloat_impl<4> p03;
  BBox1f cu_stack [4];
  BBox1f cv_stack [4];
  uint local_478;
  RTCFilterFunctionNArguments local_470;
  undefined1 local_440 [16];
  uint auStack_430 [4];
  undefined1 local_420 [32];
  undefined1 local_3f0 [16];
  undefined1 local_3e0 [8];
  float fStack_3d8;
  float fStack_3d4;
  undefined1 local_3d0 [16];
  undefined1 local_3c0 [16];
  undefined1 local_3b0 [16];
  undefined1 local_3a0 [8];
  float fStack_398;
  float fStack_394;
  undefined1 local_390 [8];
  float fStack_388;
  float fStack_384;
  undefined1 local_380 [16];
  undefined1 local_370 [16];
  undefined1 local_360 [8];
  float fStack_358;
  float fStack_354;
  undefined1 local_350 [16];
  undefined1 local_340 [8];
  float fStack_338;
  float fStack_334;
  undefined1 local_330 [16];
  undefined1 local_320 [16];
  undefined1 local_310 [16];
  undefined1 local_300 [16];
  undefined1 local_2f0 [16];
  undefined1 local_2e0 [16];
  undefined1 local_2d0 [16];
  undefined1 local_2c0 [16];
  undefined1 local_2b0 [16];
  undefined1 local_2a0 [16];
  undefined1 local_290 [16];
  undefined1 local_280 [16];
  undefined1 local_270 [8];
  float fStack_268;
  float fStack_264;
  undefined1 local_260 [32];
  undefined8 uStack_240;
  undefined1 local_220 [32];
  undefined1 local_200 [32];
  undefined1 local_1e0 [32];
  undefined4 local_1c0;
  undefined4 uStack_1bc;
  undefined4 uStack_1b8;
  undefined4 uStack_1b4;
  undefined4 uStack_1b0;
  undefined4 uStack_1ac;
  undefined4 uStack_1a8;
  undefined4 uStack_1a4;
  ulong auStack_1a0 [4];
  RTCHitN local_180 [32];
  undefined1 local_160 [32];
  undefined4 local_140;
  undefined4 uStack_13c;
  undefined4 uStack_138;
  undefined4 uStack_134;
  undefined4 uStack_130;
  undefined4 uStack_12c;
  undefined4 uStack_128;
  undefined4 uStack_124;
  float local_120;
  float fStack_11c;
  float fStack_118;
  float fStack_114;
  float fStack_110;
  float fStack_10c;
  float fStack_108;
  float fStack_104;
  undefined1 local_100 [32];
  undefined8 local_e0;
  undefined8 uStack_d8;
  undefined8 uStack_d0;
  undefined8 uStack_c8;
  undefined1 local_c0 [32];
  uint local_a0;
  uint uStack_9c;
  uint uStack_98;
  uint uStack_94;
  uint uStack_90;
  uint uStack_8c;
  uint uStack_88;
  uint uStack_84;
  uint local_80;
  uint uStack_7c;
  uint uStack_78;
  uint uStack_74;
  uint uStack_70;
  uint uStack_6c;
  uint uStack_68;
  uint uStack_64;
  ulong uVar29;
  undefined1 auVar94 [32];
  undefined1 auVar96 [32];
  undefined1 auVar98 [32];
  undefined1 auVar100 [32];
  undefined1 auVar102 [32];
  float fVar135;
  float fVar140;
  float fVar141;
  float fVar150;
  
  PVar3 = prim[1];
  uVar32 = (ulong)(byte)PVar3;
  fVar103 = *(float *)(prim + uVar32 * 0x19 + 0x12);
  auVar40 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4)),ZEXT416(*(uint *)(ray + k * 4 + 0x20)),
                          0x10);
  auVar40 = vinsertps_avx(auVar40,ZEXT416(*(uint *)(ray + k * 4 + 0x40)),0x20);
  auVar41 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4 + 0x80)),
                          ZEXT416(*(uint *)(ray + k * 4 + 0xa0)),0x10);
  auVar41 = vinsertps_avx(auVar41,ZEXT416(*(uint *)(ray + k * 4 + 0xc0)),0x20);
  auVar40 = vsubps_avx(auVar40,*(undefined1 (*) [16])(prim + uVar32 * 0x19 + 6));
  auVar59._0_4_ = fVar103 * auVar40._0_4_;
  auVar59._4_4_ = fVar103 * auVar40._4_4_;
  auVar59._8_4_ = fVar103 * auVar40._8_4_;
  auVar59._12_4_ = fVar103 * auVar40._12_4_;
  auVar49._0_4_ = fVar103 * auVar41._0_4_;
  auVar49._4_4_ = fVar103 * auVar41._4_4_;
  auVar49._8_4_ = fVar103 * auVar41._8_4_;
  auVar49._12_4_ = fVar103 * auVar41._12_4_;
  auVar40 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar32 * 4 + 6)));
  auVar40 = vcvtdq2ps_avx(auVar40);
  auVar41 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar32 * 5 + 6)));
  auVar41 = vcvtdq2ps_avx(auVar41);
  auVar42 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar32 * 6 + 6)));
  auVar51 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar32 * 0xb + 6)));
  auVar42 = vcvtdq2ps_avx(auVar42);
  auVar51 = vcvtdq2ps_avx(auVar51);
  auVar52 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + (ulong)((uint)(byte)PVar3 * 0xc) + 6)));
  auVar52 = vcvtdq2ps_avx(auVar52);
  auVar48 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + (uint)(byte)PVar3 * 0xc + uVar32 + 6)));
  auVar48 = vcvtdq2ps_avx(auVar48);
  uVar39 = (ulong)(uint)((int)(uVar32 * 9) * 2);
  auVar53 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar39 + 6)));
  auVar53 = vcvtdq2ps_avx(auVar53);
  auVar70 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar39 + uVar32 + 6)));
  auVar70 = vcvtdq2ps_avx(auVar70);
  uVar28 = (ulong)(uint)((int)(uVar32 * 5) << 2);
  auVar45 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar28 + 6)));
  auVar45 = vcvtdq2ps_avx(auVar45);
  auVar64._4_4_ = auVar49._0_4_;
  auVar64._0_4_ = auVar49._0_4_;
  auVar64._8_4_ = auVar49._0_4_;
  auVar64._12_4_ = auVar49._0_4_;
  auVar44 = vshufps_avx(auVar49,auVar49,0x55);
  auVar43 = vshufps_avx(auVar49,auVar49,0xaa);
  fVar103 = auVar43._0_4_;
  auVar65._0_4_ = fVar103 * auVar42._0_4_;
  fVar208 = auVar43._4_4_;
  auVar65._4_4_ = fVar208 * auVar42._4_4_;
  fVar197 = auVar43._8_4_;
  auVar65._8_4_ = fVar197 * auVar42._8_4_;
  fVar206 = auVar43._12_4_;
  auVar65._12_4_ = fVar206 * auVar42._12_4_;
  auVar55._0_4_ = auVar48._0_4_ * fVar103;
  auVar55._4_4_ = auVar48._4_4_ * fVar208;
  auVar55._8_4_ = auVar48._8_4_ * fVar197;
  auVar55._12_4_ = auVar48._12_4_ * fVar206;
  auVar50._0_4_ = auVar45._0_4_ * fVar103;
  auVar50._4_4_ = auVar45._4_4_ * fVar208;
  auVar50._8_4_ = auVar45._8_4_ * fVar197;
  auVar50._12_4_ = auVar45._12_4_ * fVar206;
  auVar43 = vfmadd231ps_fma(auVar65,auVar44,auVar41);
  auVar46 = vfmadd231ps_fma(auVar55,auVar44,auVar52);
  auVar44 = vfmadd231ps_fma(auVar50,auVar70,auVar44);
  auVar47 = vfmadd231ps_fma(auVar43,auVar64,auVar40);
  auVar46 = vfmadd231ps_fma(auVar46,auVar64,auVar51);
  auVar49 = vfmadd231ps_fma(auVar44,auVar53,auVar64);
  auVar66._4_4_ = auVar59._0_4_;
  auVar66._0_4_ = auVar59._0_4_;
  auVar66._8_4_ = auVar59._0_4_;
  auVar66._12_4_ = auVar59._0_4_;
  auVar44 = vshufps_avx(auVar59,auVar59,0x55);
  auVar43 = vshufps_avx(auVar59,auVar59,0xaa);
  fVar103 = auVar43._0_4_;
  auVar67._0_4_ = fVar103 * auVar42._0_4_;
  fVar208 = auVar43._4_4_;
  auVar67._4_4_ = fVar208 * auVar42._4_4_;
  fVar197 = auVar43._8_4_;
  auVar67._8_4_ = fVar197 * auVar42._8_4_;
  fVar206 = auVar43._12_4_;
  auVar67._12_4_ = fVar206 * auVar42._12_4_;
  auVar60._0_4_ = auVar48._0_4_ * fVar103;
  auVar60._4_4_ = auVar48._4_4_ * fVar208;
  auVar60._8_4_ = auVar48._8_4_ * fVar197;
  auVar60._12_4_ = auVar48._12_4_ * fVar206;
  auVar62._0_4_ = auVar45._0_4_ * fVar103;
  auVar62._4_4_ = auVar45._4_4_ * fVar208;
  auVar62._8_4_ = auVar45._8_4_ * fVar197;
  auVar62._12_4_ = auVar45._12_4_ * fVar206;
  auVar41 = vfmadd231ps_fma(auVar67,auVar44,auVar41);
  auVar42 = vfmadd231ps_fma(auVar60,auVar44,auVar52);
  auVar52 = vfmadd231ps_fma(auVar62,auVar44,auVar70);
  auVar48 = vfmadd231ps_fma(auVar41,auVar66,auVar40);
  auVar70 = vfmadd231ps_fma(auVar42,auVar66,auVar51);
  auVar40 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
  auVar244 = ZEXT1664(auVar40);
  auVar45 = vfmadd231ps_fma(auVar52,auVar66,auVar53);
  auVar41 = vandps_avx512vl(auVar47,auVar40);
  auVar56._8_4_ = 0x219392ef;
  auVar56._0_8_ = 0x219392ef219392ef;
  auVar56._12_4_ = 0x219392ef;
  uVar39 = vcmpps_avx512vl(auVar41,auVar56,1);
  bVar37 = (bool)((byte)uVar39 & 1);
  auVar43._0_4_ = (uint)bVar37 * 0x219392ef | (uint)!bVar37 * auVar47._0_4_;
  bVar37 = (bool)((byte)(uVar39 >> 1) & 1);
  auVar43._4_4_ = (uint)bVar37 * 0x219392ef | (uint)!bVar37 * auVar47._4_4_;
  bVar37 = (bool)((byte)(uVar39 >> 2) & 1);
  auVar43._8_4_ = (uint)bVar37 * 0x219392ef | (uint)!bVar37 * auVar47._8_4_;
  bVar37 = (bool)((byte)(uVar39 >> 3) & 1);
  auVar43._12_4_ = (uint)bVar37 * 0x219392ef | (uint)!bVar37 * auVar47._12_4_;
  auVar41 = vandps_avx512vl(auVar46,auVar40);
  uVar39 = vcmpps_avx512vl(auVar41,auVar56,1);
  bVar37 = (bool)((byte)uVar39 & 1);
  auVar47._0_4_ = (uint)bVar37 * 0x219392ef | (uint)!bVar37 * auVar46._0_4_;
  bVar37 = (bool)((byte)(uVar39 >> 1) & 1);
  auVar47._4_4_ = (uint)bVar37 * 0x219392ef | (uint)!bVar37 * auVar46._4_4_;
  bVar37 = (bool)((byte)(uVar39 >> 2) & 1);
  auVar47._8_4_ = (uint)bVar37 * 0x219392ef | (uint)!bVar37 * auVar46._8_4_;
  bVar37 = (bool)((byte)(uVar39 >> 3) & 1);
  auVar47._12_4_ = (uint)bVar37 * 0x219392ef | (uint)!bVar37 * auVar46._12_4_;
  auVar40 = vandps_avx512vl(auVar49,auVar40);
  uVar39 = vcmpps_avx512vl(auVar40,auVar56,1);
  bVar37 = (bool)((byte)uVar39 & 1);
  auVar46._0_4_ = (uint)bVar37 * 0x219392ef | (uint)!bVar37 * auVar49._0_4_;
  bVar37 = (bool)((byte)(uVar39 >> 1) & 1);
  auVar46._4_4_ = (uint)bVar37 * 0x219392ef | (uint)!bVar37 * auVar49._4_4_;
  bVar37 = (bool)((byte)(uVar39 >> 2) & 1);
  auVar46._8_4_ = (uint)bVar37 * 0x219392ef | (uint)!bVar37 * auVar49._8_4_;
  bVar37 = (bool)((byte)(uVar39 >> 3) & 1);
  auVar46._12_4_ = (uint)bVar37 * 0x219392ef | (uint)!bVar37 * auVar49._12_4_;
  auVar40 = vrcp14ps_avx512vl(auVar43);
  auVar41 = vbroadcastss_avx512vl(ZEXT416(0x3f800000));
  auVar245 = ZEXT1664(auVar41);
  auVar42 = vfnmadd213ps_avx512vl(auVar43,auVar40,auVar41);
  auVar51 = vfmadd132ps_fma(auVar42,auVar40,auVar40);
  auVar40 = vrcp14ps_avx512vl(auVar47);
  auVar42 = vfnmadd213ps_avx512vl(auVar47,auVar40,auVar41);
  auVar52 = vfmadd132ps_fma(auVar42,auVar40,auVar40);
  auVar40 = vrcp14ps_avx512vl(auVar46);
  auVar41 = vfnmadd213ps_avx512vl(auVar46,auVar40,auVar41);
  auVar53 = vfmadd132ps_fma(auVar41,auVar40,auVar40);
  auVar40._8_8_ = 0;
  auVar40._0_8_ = *(ulong *)(prim + uVar32 * 7 + 6);
  auVar40 = vpmovsxwd_avx(auVar40);
  auVar40 = vcvtdq2ps_avx(auVar40);
  auVar40 = vsubps_avx(auVar40,auVar48);
  auVar69._0_4_ = auVar51._0_4_ * auVar40._0_4_;
  auVar69._4_4_ = auVar51._4_4_ * auVar40._4_4_;
  auVar69._8_4_ = auVar51._8_4_ * auVar40._8_4_;
  auVar69._12_4_ = auVar51._12_4_ * auVar40._12_4_;
  auVar41._8_8_ = 0;
  auVar41._0_8_ = *(ulong *)(prim + uVar32 * 9 + 6);
  auVar40 = vpmovsxwd_avx(auVar41);
  auVar40 = vcvtdq2ps_avx(auVar40);
  auVar40 = vsubps_avx(auVar40,auVar48);
  auVar43 = vpbroadcastd_avx512vl();
  auVar42._8_8_ = 0;
  auVar42._0_8_ = *(ulong *)(prim + (ulong)(byte)PVar3 * 0x10 + 6);
  auVar41 = vpmovsxwd_avx(auVar42);
  auVar58._0_4_ = auVar51._0_4_ * auVar40._0_4_;
  auVar58._4_4_ = auVar51._4_4_ * auVar40._4_4_;
  auVar58._8_4_ = auVar51._8_4_ * auVar40._8_4_;
  auVar58._12_4_ = auVar51._12_4_ * auVar40._12_4_;
  auVar51._8_8_ = 0;
  auVar51._0_8_ = *(ulong *)(prim + (ulong)(byte)PVar3 * 0x10 + uVar32 * -2 + 6);
  auVar40 = vpmovsxwd_avx(auVar51);
  auVar40 = vcvtdq2ps_avx(auVar40);
  auVar40 = vsubps_avx(auVar40,auVar70);
  auVar57._0_4_ = auVar52._0_4_ * auVar40._0_4_;
  auVar57._4_4_ = auVar52._4_4_ * auVar40._4_4_;
  auVar57._8_4_ = auVar52._8_4_ * auVar40._8_4_;
  auVar57._12_4_ = auVar52._12_4_ * auVar40._12_4_;
  auVar40 = vcvtdq2ps_avx(auVar41);
  auVar40 = vsubps_avx(auVar40,auVar70);
  auVar63._0_4_ = auVar52._0_4_ * auVar40._0_4_;
  auVar63._4_4_ = auVar52._4_4_ * auVar40._4_4_;
  auVar63._8_4_ = auVar52._8_4_ * auVar40._8_4_;
  auVar63._12_4_ = auVar52._12_4_ * auVar40._12_4_;
  auVar52._8_8_ = 0;
  auVar52._0_8_ = *(ulong *)(prim + uVar28 + uVar32 + 6);
  auVar40 = vpmovsxwd_avx(auVar52);
  auVar40 = vcvtdq2ps_avx(auVar40);
  auVar40 = vsubps_avx(auVar40,auVar45);
  auVar61._0_4_ = auVar53._0_4_ * auVar40._0_4_;
  auVar61._4_4_ = auVar53._4_4_ * auVar40._4_4_;
  auVar61._8_4_ = auVar53._8_4_ * auVar40._8_4_;
  auVar61._12_4_ = auVar53._12_4_ * auVar40._12_4_;
  auVar48._8_8_ = 0;
  auVar48._0_8_ = *(ulong *)(prim + uVar32 * 0x17 + 6);
  auVar40 = vpmovsxwd_avx(auVar48);
  auVar40 = vcvtdq2ps_avx(auVar40);
  auVar40 = vsubps_avx(auVar40,auVar45);
  auVar54._0_4_ = auVar53._0_4_ * auVar40._0_4_;
  auVar54._4_4_ = auVar53._4_4_ * auVar40._4_4_;
  auVar54._8_4_ = auVar53._8_4_ * auVar40._8_4_;
  auVar54._12_4_ = auVar53._12_4_ * auVar40._12_4_;
  auVar40 = vpminsd_avx(auVar69,auVar58);
  auVar41 = vpminsd_avx(auVar57,auVar63);
  auVar40 = vmaxps_avx(auVar40,auVar41);
  auVar41 = vpminsd_avx(auVar61,auVar54);
  uVar110 = *(undefined4 *)(ray + k * 4 + 0x60);
  auVar53._4_4_ = uVar110;
  auVar53._0_4_ = uVar110;
  auVar53._8_4_ = uVar110;
  auVar53._12_4_ = uVar110;
  auVar41 = vmaxps_avx512vl(auVar41,auVar53);
  auVar40 = vmaxps_avx(auVar40,auVar41);
  auVar70._8_4_ = 0x3f7ffffa;
  auVar70._0_8_ = 0x3f7ffffa3f7ffffa;
  auVar70._12_4_ = 0x3f7ffffa;
  local_3f0 = vmulps_avx512vl(auVar40,auVar70);
  auVar40 = vpmaxsd_avx(auVar69,auVar58);
  auVar41 = vpmaxsd_avx(auVar57,auVar63);
  auVar40 = vminps_avx(auVar40,auVar41);
  auVar41 = vpmaxsd_avx(auVar61,auVar54);
  uVar110 = *(undefined4 *)(ray + k * 4 + 0x100);
  auVar45._4_4_ = uVar110;
  auVar45._0_4_ = uVar110;
  auVar45._8_4_ = uVar110;
  auVar45._12_4_ = uVar110;
  auVar41 = vminps_avx512vl(auVar41,auVar45);
  auVar40 = vminps_avx(auVar40,auVar41);
  auVar44._8_4_ = 0x3f800003;
  auVar44._0_8_ = 0x3f8000033f800003;
  auVar44._12_4_ = 0x3f800003;
  auVar40 = vmulps_avx512vl(auVar40,auVar44);
  uVar13 = vcmpps_avx512vl(local_3f0,auVar40,2);
  uVar39 = vpcmpgtd_avx512vl(auVar43,_DAT_01f7fcf0);
  uVar39 = ((byte)uVar13 & 0xf) & uVar39;
  if ((char)uVar39 != '\0') {
    local_220 = vpmovm2d_avx512vl((ulong)(uint)(1 << ((uint)k & 0x1f)));
    auVar40 = vbroadcastss_avx512vl(ZEXT416(0x40400000));
    auVar239 = ZEXT1664(auVar40);
    auVar40 = vbroadcastss_avx512vl(ZEXT416(0x80000000));
    auVar240 = ZEXT1664(auVar40);
    auVar247 = ZEXT464(0x3f800000);
    auVar40 = vxorps_avx512vl(in_ZMM29._0_16_,in_ZMM29._0_16_);
    auVar246 = ZEXT1664(auVar40);
    do {
      lVar30 = 0;
      for (uVar28 = uVar39; (uVar28 & 1) == 0; uVar28 = uVar28 >> 1 | 0x8000000000000000) {
        lVar30 = lVar30 + 1;
      }
      uVar34 = *(uint *)(prim + 2);
      uVar4 = *(uint *)(prim + lVar30 * 4 + 6);
      pGVar6 = (context->scene->geometries).items[uVar34].ptr;
      lVar7 = *(long *)&pGVar6[1].time_range.upper;
      uVar28 = (ulong)*(uint *)(*(long *)&pGVar6->field_0x58 +
                               (ulong)uVar4 *
                               pGVar6[1].super_RefCount.refCounter.
                               super___atomic_base<unsigned_long>._M_i);
      auVar40 = *(undefined1 (*) [16])(lVar7 + (long)pGVar6[1].intersectionFilterN * uVar28);
      lVar30 = uVar28 + 1;
      auVar41 = *(undefined1 (*) [16])(lVar7 + (long)pGVar6[1].intersectionFilterN * lVar30);
      _Var8 = pGVar6[2].super_RefCount.refCounter.super___atomic_base<unsigned_long>._M_i;
      auVar42 = *(undefined1 (*) [16])(_Var8 + (long)pGVar6[2].userPtr * uVar28);
      auVar51 = *(undefined1 (*) [16])(_Var8 + (long)pGVar6[2].userPtr * lVar30);
      auVar52 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4)),ZEXT416(*(uint *)(ray + k * 4 + 0x20))
                              ,0x1c);
      auVar52 = vinsertps_avx(auVar52,ZEXT416(*(uint *)(ray + k * 4 + 0x40)),0x28);
      fVar103 = *(float *)(ray + k * 4 + 0x60);
      auVar44 = vbroadcastss_avx512vl(ZEXT416(0x3eaaaaab));
      auVar45 = vfmadd132ps_avx512vl
                          (*(undefined1 (*) [16])
                            (pGVar6[2].intersectionFilterN + (long)pGVar6[2].pointQueryFunc * uVar28
                            ),auVar40,auVar44);
      auVar43 = vfnmadd132ps_avx512vl
                          (*(undefined1 (*) [16])
                            (pGVar6[2].intersectionFilterN + (long)pGVar6[2].pointQueryFunc * lVar30
                            ),auVar41,auVar44);
      auVar46 = vfmadd132ps_avx512vl
                          (*(undefined1 (*) [16])
                            ((long)pGVar6[3].userPtr + uVar28 * *(long *)&pGVar6[3].fnumTimeSegments
                            ),auVar42,auVar44);
      auVar47 = vfnmadd132ps_avx512vl
                          (*(undefined1 (*) [16])
                            ((long)pGVar6[3].userPtr + *(long *)&pGVar6[3].fnumTimeSegments * lVar30
                            ),auVar51,auVar44);
      auVar54 = ZEXT816(0) << 0x40;
      auVar111._0_4_ = auVar41._0_4_ * 0.0;
      auVar111._4_4_ = auVar41._4_4_ * 0.0;
      auVar111._8_4_ = auVar41._8_4_ * 0.0;
      auVar111._12_4_ = auVar41._12_4_ * 0.0;
      auVar53 = vfmadd231ps_fma(auVar111,auVar43,auVar54);
      auVar48 = vfmadd213ps_fma(ZEXT816(0) << 0x40,auVar45,auVar53);
      auVar119._0_4_ = auVar40._0_4_ + auVar48._0_4_;
      auVar119._4_4_ = auVar40._4_4_ + auVar48._4_4_;
      auVar119._8_4_ = auVar40._8_4_ + auVar48._8_4_;
      auVar119._12_4_ = auVar40._12_4_ + auVar48._12_4_;
      auVar55 = auVar239._0_16_;
      auVar48 = vfmadd231ps_avx512vl(auVar53,auVar45,auVar55);
      auVar49 = vfnmadd231ps_avx512vl(auVar48,auVar40,auVar55);
      auVar210._0_4_ = auVar51._0_4_ * 0.0;
      auVar210._4_4_ = auVar51._4_4_ * 0.0;
      auVar210._8_4_ = auVar51._8_4_ * 0.0;
      auVar210._12_4_ = auVar51._12_4_ * 0.0;
      auVar53 = vfmadd231ps_fma(auVar210,auVar47,auVar54);
      auVar48 = vfmadd213ps_fma(ZEXT816(0) << 0x40,auVar46,auVar53);
      auVar224._0_4_ = auVar42._0_4_ + auVar48._0_4_;
      auVar224._4_4_ = auVar42._4_4_ + auVar48._4_4_;
      auVar224._8_4_ = auVar42._8_4_ + auVar48._8_4_;
      auVar224._12_4_ = auVar42._12_4_ + auVar48._12_4_;
      auVar48 = vfmadd231ps_avx512vl(auVar53,auVar46,auVar55);
      auVar50 = vfnmadd231ps_avx512vl(auVar48,auVar42,auVar55);
      auVar48 = vfmadd213ps_fma(ZEXT816(0) << 0x20,auVar43,auVar41);
      auVar48 = vfmadd231ps_fma(auVar48,auVar45,auVar54);
      auVar70 = vfmadd231ps_fma(auVar48,auVar40,auVar54);
      auVar41 = vmulps_avx512vl(auVar41,auVar55);
      auVar41 = vfnmadd231ps_avx512vl(auVar41,auVar55,auVar43);
      auVar41 = vfmadd231ps_fma(auVar41,auVar54,auVar45);
      auVar45 = vfnmadd231ps_fma(auVar41,auVar54,auVar40);
      auVar40 = vfmadd213ps_fma(ZEXT816(0) << 0x20,auVar47,auVar51);
      auVar40 = vfmadd231ps_fma(auVar40,auVar46,auVar54);
      auVar48 = vfmadd231ps_fma(auVar40,auVar42,auVar54);
      auVar40 = vmulps_avx512vl(auVar51,auVar55);
      auVar40 = vfnmadd231ps_avx512vl(auVar40,auVar55,auVar47);
      auVar40 = vfmadd231ps_fma(auVar40,auVar54,auVar46);
      auVar53 = vfnmadd231ps_fma(auVar40,auVar54,auVar42);
      auVar40 = vshufps_avx(auVar49,auVar49,0xc9);
      auVar41 = vshufps_avx(auVar224,auVar224,0xc9);
      fVar109 = auVar49._0_4_;
      auVar161._0_4_ = fVar109 * auVar41._0_4_;
      fVar116 = auVar49._4_4_;
      auVar161._4_4_ = fVar116 * auVar41._4_4_;
      fVar117 = auVar49._8_4_;
      auVar161._8_4_ = fVar117 * auVar41._8_4_;
      fVar118 = auVar49._12_4_;
      auVar161._12_4_ = fVar118 * auVar41._12_4_;
      auVar41 = vfmsub231ps_fma(auVar161,auVar40,auVar224);
      auVar42 = vshufps_avx(auVar41,auVar41,0xc9);
      auVar41 = vshufps_avx(auVar50,auVar50,0xc9);
      auVar180._0_4_ = auVar41._0_4_ * fVar109;
      auVar180._4_4_ = auVar41._4_4_ * fVar116;
      auVar180._8_4_ = auVar41._8_4_ * fVar117;
      auVar180._12_4_ = auVar41._12_4_ * fVar118;
      auVar40 = vfmsub231ps_fma(auVar180,auVar40,auVar50);
      auVar51 = vshufps_avx(auVar40,auVar40,0xc9);
      auVar40 = vshufps_avx(auVar45,auVar45,0xc9);
      auVar41 = vshufps_avx(auVar48,auVar48,0xc9);
      fVar208 = auVar45._0_4_;
      auVar190._0_4_ = auVar41._0_4_ * fVar208;
      fVar197 = auVar45._4_4_;
      auVar190._4_4_ = auVar41._4_4_ * fVar197;
      fVar206 = auVar45._8_4_;
      auVar190._8_4_ = auVar41._8_4_ * fVar206;
      fVar207 = auVar45._12_4_;
      auVar190._12_4_ = auVar41._12_4_ * fVar207;
      auVar41 = vfmsub231ps_fma(auVar190,auVar40,auVar48);
      auVar48 = vshufps_avx(auVar41,auVar41,0xc9);
      auVar41 = vshufps_avx(auVar53,auVar53,0xc9);
      auVar191._0_4_ = auVar41._0_4_ * fVar208;
      auVar191._4_4_ = auVar41._4_4_ * fVar197;
      auVar191._8_4_ = auVar41._8_4_ * fVar206;
      auVar191._12_4_ = auVar41._12_4_ * fVar207;
      auVar40 = vfmsub231ps_fma(auVar191,auVar40,auVar53);
      auVar53 = vshufps_avx(auVar40,auVar40,0xc9);
      auVar40 = vdpps_avx(auVar42,auVar42,0x7f);
      fVar135 = auVar40._0_4_;
      auVar192._4_12_ = ZEXT812(0) << 0x20;
      auVar192._0_4_ = fVar135;
      auVar41 = vrsqrt14ss_avx512f(auVar54,auVar192);
      auVar43 = vmulss_avx512f(auVar41,ZEXT416(0x3fc00000));
      auVar46 = vmulss_avx512f(auVar40,ZEXT416(0x3f000000));
      fVar140 = auVar41._0_4_;
      fVar141 = auVar43._0_4_ - auVar46._0_4_ * fVar140 * fVar140 * fVar140;
      auVar41 = vdpps_avx(auVar42,auVar51,0x7f);
      fVar223 = fVar141 * auVar42._0_4_;
      fVar228 = fVar141 * auVar42._4_4_;
      fVar229 = fVar141 * auVar42._8_4_;
      fVar230 = fVar141 * auVar42._12_4_;
      auVar181._0_4_ = fVar135 * auVar51._0_4_;
      auVar181._4_4_ = fVar135 * auVar51._4_4_;
      auVar181._8_4_ = fVar135 * auVar51._8_4_;
      auVar181._12_4_ = fVar135 * auVar51._12_4_;
      fVar135 = auVar41._0_4_;
      auVar162._0_4_ = fVar135 * auVar42._0_4_;
      auVar162._4_4_ = fVar135 * auVar42._4_4_;
      auVar162._8_4_ = fVar135 * auVar42._8_4_;
      auVar162._12_4_ = fVar135 * auVar42._12_4_;
      auVar42 = vsubps_avx(auVar181,auVar162);
      auVar41 = vrcp14ss_avx512f(auVar54,auVar192);
      auVar40 = vfnmadd213ss_avx512f(auVar40,auVar41,ZEXT416(0x40000000));
      fVar135 = auVar41._0_4_ * auVar40._0_4_;
      auVar40 = vdpps_avx(auVar48,auVar48,0x7f);
      fVar140 = auVar40._0_4_;
      auVar182._4_12_ = ZEXT812(0) << 0x20;
      auVar182._0_4_ = fVar140;
      auVar41 = vrsqrt14ss_avx512f(auVar54,auVar182);
      auVar51 = vmulss_avx512f(auVar41,ZEXT416(0x3fc00000));
      auVar43 = vmulss_avx512f(auVar40,ZEXT416(0x3f000000));
      fVar150 = auVar41._0_4_;
      fVar150 = auVar51._0_4_ - auVar43._0_4_ * fVar150 * fVar150 * fVar150;
      auVar41 = vdpps_avx(auVar48,auVar53,0x7f);
      fVar209 = fVar150 * auVar48._0_4_;
      fVar220 = fVar150 * auVar48._4_4_;
      fVar221 = fVar150 * auVar48._8_4_;
      fVar222 = fVar150 * auVar48._12_4_;
      auVar151._0_4_ = fVar140 * auVar53._0_4_;
      auVar151._4_4_ = fVar140 * auVar53._4_4_;
      auVar151._8_4_ = fVar140 * auVar53._8_4_;
      auVar151._12_4_ = fVar140 * auVar53._12_4_;
      fVar140 = auVar41._0_4_;
      auVar142._0_4_ = fVar140 * auVar48._0_4_;
      auVar142._4_4_ = fVar140 * auVar48._4_4_;
      auVar142._8_4_ = fVar140 * auVar48._8_4_;
      auVar142._12_4_ = fVar140 * auVar48._12_4_;
      auVar51 = vsubps_avx(auVar151,auVar142);
      auVar41 = vrcp14ss_avx512f(auVar54,auVar182);
      auVar40 = vfnmadd213ss_avx512f(auVar40,auVar41,ZEXT416(0x40000000));
      fVar140 = auVar40._0_4_ * auVar41._0_4_;
      auVar40 = vshufps_avx(auVar119,auVar119,0xff);
      auVar168._0_4_ = fVar223 * auVar40._0_4_;
      auVar168._4_4_ = fVar228 * auVar40._4_4_;
      auVar168._8_4_ = fVar229 * auVar40._8_4_;
      auVar168._12_4_ = fVar230 * auVar40._12_4_;
      local_330 = vsubps_avx(auVar119,auVar168);
      auVar41 = vshufps_avx(auVar49,auVar49,0xff);
      auVar152._0_4_ = auVar41._0_4_ * fVar223 + auVar40._0_4_ * fVar141 * fVar135 * auVar42._0_4_;
      auVar152._4_4_ = auVar41._4_4_ * fVar228 + auVar40._4_4_ * fVar141 * fVar135 * auVar42._4_4_;
      auVar152._8_4_ = auVar41._8_4_ * fVar229 + auVar40._8_4_ * fVar141 * fVar135 * auVar42._8_4_;
      auVar152._12_4_ =
           auVar41._12_4_ * fVar230 + auVar40._12_4_ * fVar141 * fVar135 * auVar42._12_4_;
      auVar42 = vsubps_avx(auVar49,auVar152);
      local_340._0_4_ = auVar168._0_4_ + auVar119._0_4_;
      local_340._4_4_ = auVar168._4_4_ + auVar119._4_4_;
      fStack_338 = auVar168._8_4_ + auVar119._8_4_;
      fStack_334 = auVar168._12_4_ + auVar119._12_4_;
      auVar112._0_4_ = fVar109 + auVar152._0_4_;
      auVar112._4_4_ = fVar116 + auVar152._4_4_;
      auVar112._8_4_ = fVar117 + auVar152._8_4_;
      auVar112._12_4_ = fVar118 + auVar152._12_4_;
      auVar40 = vshufps_avx(auVar70,auVar70,0xff);
      auVar153._0_4_ = fVar209 * auVar40._0_4_;
      auVar153._4_4_ = fVar220 * auVar40._4_4_;
      auVar153._8_4_ = fVar221 * auVar40._8_4_;
      auVar153._12_4_ = fVar222 * auVar40._12_4_;
      local_350 = vsubps_avx(auVar70,auVar153);
      auVar41 = vshufps_avx(auVar45,auVar45,0xff);
      auVar120._0_4_ = auVar41._0_4_ * fVar209 + auVar40._0_4_ * fVar150 * auVar51._0_4_ * fVar140;
      auVar120._4_4_ = auVar41._4_4_ * fVar220 + auVar40._4_4_ * fVar150 * auVar51._4_4_ * fVar140;
      auVar120._8_4_ = auVar41._8_4_ * fVar221 + auVar40._8_4_ * fVar150 * auVar51._8_4_ * fVar140;
      auVar120._12_4_ =
           auVar41._12_4_ * fVar222 + auVar40._12_4_ * fVar150 * auVar51._12_4_ * fVar140;
      auVar40 = vsubps_avx(auVar45,auVar120);
      _local_360 = vaddps_avx512vl(auVar70,auVar153);
      auVar121._0_4_ = fVar208 + auVar120._0_4_;
      auVar121._4_4_ = fVar197 + auVar120._4_4_;
      auVar121._8_4_ = fVar206 + auVar120._8_4_;
      auVar121._12_4_ = fVar207 + auVar120._12_4_;
      auVar41 = vmulps_avx512vl(auVar42,auVar44);
      local_370 = vaddps_avx512vl(local_330,auVar41);
      auVar40 = vmulps_avx512vl(auVar40,auVar44);
      local_380 = vsubps_avx512vl(local_350,auVar40);
      auVar40 = vmulps_avx512vl(auVar112,auVar44);
      _local_390 = vaddps_avx512vl(_local_340,auVar40);
      auVar40 = vmulps_avx512vl(auVar121,auVar44);
      _local_3a0 = vsubps_avx512vl(_local_360,auVar40);
      local_2b0 = vsubps_avx(local_330,auVar52);
      uVar110 = local_2b0._0_4_;
      auVar122._4_4_ = uVar110;
      auVar122._0_4_ = uVar110;
      auVar122._8_4_ = uVar110;
      auVar122._12_4_ = uVar110;
      auVar40 = vshufps_avx(local_2b0,local_2b0,0x55);
      auVar41 = vshufps_avx(local_2b0,local_2b0,0xaa);
      aVar1 = pre->ray_space[k].vx.field_0;
      aVar2 = pre->ray_space[k].vy.field_0;
      fVar208 = pre->ray_space[k].vz.field_0.m128[0];
      fVar197 = pre->ray_space[k].vz.field_0.m128[1];
      fVar206 = pre->ray_space[k].vz.field_0.m128[2];
      fVar207 = pre->ray_space[k].vz.field_0.m128[3];
      auVar113._0_4_ = fVar208 * auVar41._0_4_;
      auVar113._4_4_ = fVar197 * auVar41._4_4_;
      auVar113._8_4_ = fVar206 * auVar41._8_4_;
      auVar113._12_4_ = fVar207 * auVar41._12_4_;
      auVar40 = vfmadd231ps_fma(auVar113,(undefined1  [16])aVar2,auVar40);
      auVar48 = vfmadd231ps_fma(auVar40,(undefined1  [16])aVar1,auVar122);
      local_2c0 = vsubps_avx512vl(local_370,auVar52);
      uVar110 = local_2c0._0_4_;
      auVar128._4_4_ = uVar110;
      auVar128._0_4_ = uVar110;
      auVar128._8_4_ = uVar110;
      auVar128._12_4_ = uVar110;
      auVar40 = vshufps_avx(local_2c0,local_2c0,0x55);
      auVar41 = vshufps_avx(local_2c0,local_2c0,0xaa);
      auVar123._0_4_ = fVar208 * auVar41._0_4_;
      auVar123._4_4_ = fVar197 * auVar41._4_4_;
      auVar123._8_4_ = fVar206 * auVar41._8_4_;
      auVar123._12_4_ = fVar207 * auVar41._12_4_;
      auVar40 = vfmadd231ps_fma(auVar123,(undefined1  [16])aVar2,auVar40);
      auVar53 = vfmadd231ps_fma(auVar40,(undefined1  [16])aVar1,auVar128);
      local_2d0 = vsubps_avx512vl(local_380,auVar52);
      uVar110 = local_2d0._0_4_;
      auVar154._4_4_ = uVar110;
      auVar154._0_4_ = uVar110;
      auVar154._8_4_ = uVar110;
      auVar154._12_4_ = uVar110;
      auVar40 = vshufps_avx(local_2d0,local_2d0,0x55);
      auVar41 = vshufps_avx(local_2d0,local_2d0,0xaa);
      auVar129._0_4_ = fVar208 * auVar41._0_4_;
      auVar129._4_4_ = fVar197 * auVar41._4_4_;
      auVar129._8_4_ = fVar206 * auVar41._8_4_;
      auVar129._12_4_ = fVar207 * auVar41._12_4_;
      auVar40 = vfmadd231ps_fma(auVar129,(undefined1  [16])aVar2,auVar40);
      auVar70 = vfmadd231ps_fma(auVar40,(undefined1  [16])aVar1,auVar154);
      local_2e0 = vsubps_avx(local_350,auVar52);
      uVar110 = local_2e0._0_4_;
      auVar169._4_4_ = uVar110;
      auVar169._0_4_ = uVar110;
      auVar169._8_4_ = uVar110;
      auVar169._12_4_ = uVar110;
      auVar40 = vshufps_avx(local_2e0,local_2e0,0x55);
      auVar41 = vshufps_avx(local_2e0,local_2e0,0xaa);
      auVar155._0_4_ = fVar208 * auVar41._0_4_;
      auVar155._4_4_ = fVar197 * auVar41._4_4_;
      auVar155._8_4_ = fVar206 * auVar41._8_4_;
      auVar155._12_4_ = fVar207 * auVar41._12_4_;
      auVar40 = vfmadd231ps_fma(auVar155,(undefined1  [16])aVar2,auVar40);
      auVar45 = vfmadd231ps_fma(auVar40,(undefined1  [16])aVar1,auVar169);
      local_2f0 = vsubps_avx(_local_340,auVar52);
      uVar110 = local_2f0._0_4_;
      auVar170._4_4_ = uVar110;
      auVar170._0_4_ = uVar110;
      auVar170._8_4_ = uVar110;
      auVar170._12_4_ = uVar110;
      auVar40 = vshufps_avx(local_2f0,local_2f0,0x55);
      auVar41 = vshufps_avx(local_2f0,local_2f0,0xaa);
      auVar193._0_4_ = auVar41._0_4_ * fVar208;
      auVar193._4_4_ = auVar41._4_4_ * fVar197;
      auVar193._8_4_ = auVar41._8_4_ * fVar206;
      auVar193._12_4_ = auVar41._12_4_ * fVar207;
      auVar40 = vfmadd231ps_fma(auVar193,(undefined1  [16])aVar2,auVar40);
      auVar44 = vfmadd231ps_fma(auVar40,(undefined1  [16])aVar1,auVar170);
      local_300 = vsubps_avx512vl(_local_390,auVar52);
      uVar110 = local_300._0_4_;
      auVar171._4_4_ = uVar110;
      auVar171._0_4_ = uVar110;
      auVar171._8_4_ = uVar110;
      auVar171._12_4_ = uVar110;
      auVar40 = vshufps_avx(local_300,local_300,0x55);
      auVar41 = vshufps_avx(local_300,local_300,0xaa);
      auVar198._0_4_ = auVar41._0_4_ * fVar208;
      auVar198._4_4_ = auVar41._4_4_ * fVar197;
      auVar198._8_4_ = auVar41._8_4_ * fVar206;
      auVar198._12_4_ = auVar41._12_4_ * fVar207;
      auVar40 = vfmadd231ps_fma(auVar198,(undefined1  [16])aVar2,auVar40);
      auVar43 = vfmadd231ps_fma(auVar40,(undefined1  [16])aVar1,auVar171);
      local_310 = vsubps_avx512vl(_local_3a0,auVar52);
      uVar110 = local_310._0_4_;
      auVar172._4_4_ = uVar110;
      auVar172._0_4_ = uVar110;
      auVar172._8_4_ = uVar110;
      auVar172._12_4_ = uVar110;
      auVar40 = vshufps_avx(local_310,local_310,0x55);
      auVar41 = vshufps_avx(local_310,local_310,0xaa);
      auVar211._0_4_ = auVar41._0_4_ * fVar208;
      auVar211._4_4_ = auVar41._4_4_ * fVar197;
      auVar211._8_4_ = auVar41._8_4_ * fVar206;
      auVar211._12_4_ = auVar41._12_4_ * fVar207;
      auVar40 = vfmadd231ps_fma(auVar211,(undefined1  [16])aVar2,auVar40);
      auVar46 = vfmadd231ps_fma(auVar40,(undefined1  [16])aVar1,auVar172);
      local_320 = vsubps_avx512vl(_local_360,auVar52);
      uVar110 = local_320._0_4_;
      auVar104._4_4_ = uVar110;
      auVar104._0_4_ = uVar110;
      auVar104._8_4_ = uVar110;
      auVar104._12_4_ = uVar110;
      auVar40 = vshufps_avx(local_320,local_320,0x55);
      auVar41 = vshufps_avx(local_320,local_320,0xaa);
      auVar163._0_4_ = auVar41._0_4_ * fVar208;
      auVar163._4_4_ = auVar41._4_4_ * fVar197;
      auVar163._8_4_ = auVar41._8_4_ * fVar206;
      auVar163._12_4_ = auVar41._12_4_ * fVar207;
      auVar40 = vfmadd231ps_fma(auVar163,(undefined1  [16])aVar2,auVar40);
      auVar47 = vfmadd231ps_fma(auVar40,(undefined1  [16])aVar1,auVar104);
      auVar42 = vmovlhps_avx(auVar48,auVar44);
      auVar51 = vmovlhps_avx(auVar53,auVar43);
      local_440 = vmovlhps_avx512f(auVar70,auVar46);
      _local_270 = vmovlhps_avx512f(auVar45,auVar47);
      auVar41 = vminps_avx(auVar42,auVar51);
      auVar40 = vmaxps_avx(auVar42,auVar51);
      auVar52 = vminps_avx512vl(local_440,_local_270);
      auVar41 = vminps_avx(auVar41,auVar52);
      auVar52 = vmaxps_avx512vl(local_440,_local_270);
      auVar40 = vmaxps_avx(auVar40,auVar52);
      auVar52 = vshufpd_avx(auVar41,auVar41,3);
      auVar41 = vminps_avx(auVar41,auVar52);
      auVar52 = vshufpd_avx(auVar40,auVar40,3);
      auVar40 = vmaxps_avx(auVar40,auVar52);
      auVar41 = vandps_avx512vl(auVar41,auVar244._0_16_);
      auVar40 = vandps_avx512vl(auVar40,auVar244._0_16_);
      auVar40 = vmaxps_avx(auVar41,auVar40);
      auVar41 = vmovshdup_avx(auVar40);
      auVar40 = vmaxss_avx(auVar41,auVar40);
      local_478 = (uint)uVar39 + 0xf;
      auVar52 = vmovddup_avx512vl(auVar48);
      auVar48 = vmovddup_avx512vl(auVar53);
      auVar53 = vmovddup_avx512vl(auVar70);
      auVar114._8_8_ = auVar45._0_8_;
      auVar114._0_8_ = auVar45._0_8_;
      local_280 = ZEXT416((uint)(auVar40._0_4_ * 9.536743e-07));
      local_260 = vbroadcastss_avx512vl(local_280);
      auVar40 = vxorps_avx512vl(local_260._0_16_,auVar240._0_16_);
      local_1c0 = auVar40._0_4_;
      uStack_1bc = local_1c0;
      uStack_1b8 = local_1c0;
      uStack_1b4 = local_1c0;
      uStack_1b0 = local_1c0;
      uStack_1ac = local_1c0;
      uStack_1a8 = local_1c0;
      uStack_1a4 = local_1c0;
      uVar28 = 0;
      auVar40 = vsubps_avx(auVar51,auVar42);
      local_290 = vsubps_avx512vl(local_440,auVar51);
      local_2a0 = vsubps_avx512vl(_local_270,local_440);
      local_3b0 = vsubps_avx(_local_340,local_330);
      local_3c0 = vsubps_avx512vl(_local_390,local_370);
      local_3d0 = vsubps_avx512vl(_local_3a0,local_380);
      _local_3e0 = vsubps_avx512vl(_local_360,local_350);
      local_1e0 = vpbroadcastd_avx512vl();
      local_200 = vpbroadcastd_avx512vl();
      auVar41 = ZEXT816(0x3f80000000000000);
      auVar68 = auVar41;
LAB_01aaed17:
      auVar70 = vshufps_avx(auVar68,auVar68,0x50);
      auVar231._8_4_ = 0x3f800000;
      auVar231._0_8_ = 0x3f8000003f800000;
      auVar231._12_4_ = 0x3f800000;
      auVar91._16_4_ = 0x3f800000;
      auVar91._0_16_ = auVar231;
      auVar91._20_4_ = 0x3f800000;
      auVar91._24_4_ = 0x3f800000;
      auVar91._28_4_ = 0x3f800000;
      auVar45 = vsubps_avx(auVar231,auVar70);
      fVar208 = auVar70._0_4_;
      fVar135 = auVar44._0_4_;
      auVar136._0_4_ = fVar135 * fVar208;
      fVar197 = auVar70._4_4_;
      fVar140 = auVar44._4_4_;
      auVar136._4_4_ = fVar140 * fVar197;
      fVar206 = auVar70._8_4_;
      auVar136._8_4_ = fVar135 * fVar206;
      fVar207 = auVar70._12_4_;
      auVar136._12_4_ = fVar140 * fVar207;
      fVar141 = auVar43._0_4_;
      auVar143._0_4_ = fVar141 * fVar208;
      fVar150 = auVar43._4_4_;
      auVar143._4_4_ = fVar150 * fVar197;
      auVar143._8_4_ = fVar141 * fVar206;
      auVar143._12_4_ = fVar150 * fVar207;
      fVar109 = auVar46._0_4_;
      auVar156._0_4_ = fVar109 * fVar208;
      fVar116 = auVar46._4_4_;
      auVar156._4_4_ = fVar116 * fVar197;
      auVar156._8_4_ = fVar109 * fVar206;
      auVar156._12_4_ = fVar116 * fVar207;
      fVar117 = auVar47._0_4_;
      auVar124._0_4_ = fVar117 * fVar208;
      fVar118 = auVar47._4_4_;
      auVar124._4_4_ = fVar118 * fVar197;
      auVar124._8_4_ = fVar117 * fVar206;
      auVar124._12_4_ = fVar118 * fVar207;
      auVar49 = vfmadd231ps_avx512vl(auVar136,auVar45,auVar52);
      auVar50 = vfmadd231ps_avx512vl(auVar143,auVar45,auVar48);
      auVar54 = vfmadd231ps_avx512vl(auVar156,auVar45,auVar53);
      auVar45 = vfmadd231ps_fma(auVar124,auVar114,auVar45);
      auVar70 = vmovshdup_avx(auVar41);
      fVar197 = auVar41._0_4_;
      fVar208 = (auVar70._0_4_ - fVar197) * 0.04761905;
      auVar85._4_4_ = fVar197;
      auVar85._0_4_ = fVar197;
      auVar85._8_4_ = fVar197;
      auVar85._12_4_ = fVar197;
      auVar85._16_4_ = fVar197;
      auVar85._20_4_ = fVar197;
      auVar85._24_4_ = fVar197;
      auVar85._28_4_ = fVar197;
      auVar75._0_8_ = auVar70._0_8_;
      auVar75._8_8_ = auVar75._0_8_;
      auVar75._16_8_ = auVar75._0_8_;
      auVar75._24_8_ = auVar75._0_8_;
      auVar88 = vsubps_avx(auVar75,auVar85);
      uVar110 = auVar49._0_4_;
      auVar89._4_4_ = uVar110;
      auVar89._0_4_ = uVar110;
      auVar89._8_4_ = uVar110;
      auVar89._12_4_ = uVar110;
      auVar89._16_4_ = uVar110;
      auVar89._20_4_ = uVar110;
      auVar89._24_4_ = uVar110;
      auVar89._28_4_ = uVar110;
      auVar77._8_4_ = 1;
      auVar77._0_8_ = 0x100000001;
      auVar77._12_4_ = 1;
      auVar77._16_4_ = 1;
      auVar77._20_4_ = 1;
      auVar77._24_4_ = 1;
      auVar77._28_4_ = 1;
      auVar87 = ZEXT1632(auVar49);
      auVar86 = vpermps_avx2(auVar77,auVar87);
      auVar71 = vbroadcastss_avx512vl(auVar50);
      auVar81 = ZEXT1632(auVar50);
      auVar72 = vpermps_avx512vl(auVar77,auVar81);
      auVar73 = vbroadcastss_avx512vl(auVar54);
      auVar82 = ZEXT1632(auVar54);
      auVar74 = vpermps_avx512vl(auVar77,auVar82);
      auVar75 = vbroadcastss_avx512vl(auVar45);
      auVar84 = ZEXT1632(auVar45);
      auVar76 = vpermps_avx512vl(auVar77,auVar84);
      auVar90._4_4_ = fVar208;
      auVar90._0_4_ = fVar208;
      auVar90._8_4_ = fVar208;
      auVar90._12_4_ = fVar208;
      auVar90._16_4_ = fVar208;
      auVar90._20_4_ = fVar208;
      auVar90._24_4_ = fVar208;
      auVar90._28_4_ = fVar208;
      auVar83._8_4_ = 2;
      auVar83._0_8_ = 0x200000002;
      auVar83._12_4_ = 2;
      auVar83._16_4_ = 2;
      auVar83._20_4_ = 2;
      auVar83._24_4_ = 2;
      auVar83._28_4_ = 2;
      auVar77 = vpermps_avx512vl(auVar83,auVar87);
      auVar78 = vbroadcastss_avx512vl(ZEXT416(3));
      auVar79 = vpermps_avx512vl(auVar78,auVar87);
      auVar80 = vpermps_avx512vl(auVar83,auVar81);
      auVar81 = vpermps_avx512vl(auVar78,auVar81);
      auVar87 = vpermps_avx2(auVar83,auVar82);
      auVar82 = vpermps_avx512vl(auVar78,auVar82);
      auVar83 = vpermps_avx512vl(auVar83,auVar84);
      auVar78 = vpermps_avx512vl(auVar78,auVar84);
      auVar70 = vfmadd132ps_fma(auVar88,auVar85,_DAT_01faff20);
      auVar88 = vsubps_avx(auVar91,ZEXT1632(auVar70));
      auVar84 = vmulps_avx512vl(auVar71,ZEXT1632(auVar70));
      auVar91 = ZEXT1632(auVar70);
      auVar85 = vmulps_avx512vl(auVar72,auVar91);
      auVar45 = vfmadd231ps_fma(auVar84,auVar88,auVar89);
      auVar49 = vfmadd231ps_fma(auVar85,auVar88,auVar86);
      auVar84 = vmulps_avx512vl(auVar73,auVar91);
      auVar85 = vmulps_avx512vl(auVar74,auVar91);
      auVar84 = vfmadd231ps_avx512vl(auVar84,auVar88,auVar71);
      auVar85 = vfmadd231ps_avx512vl(auVar85,auVar88,auVar72);
      auVar71 = vmulps_avx512vl(auVar75,auVar91);
      auVar89 = ZEXT1632(auVar70);
      auVar72 = vmulps_avx512vl(auVar76,auVar89);
      auVar73 = vfmadd231ps_avx512vl(auVar71,auVar88,auVar73);
      auVar74 = vfmadd231ps_avx512vl(auVar72,auVar88,auVar74);
      fVar206 = auVar70._0_4_;
      fVar207 = auVar70._4_4_;
      auVar71._4_4_ = fVar207 * auVar84._4_4_;
      auVar71._0_4_ = fVar206 * auVar84._0_4_;
      fVar209 = auVar70._8_4_;
      auVar71._8_4_ = fVar209 * auVar84._8_4_;
      fVar220 = auVar70._12_4_;
      auVar71._12_4_ = fVar220 * auVar84._12_4_;
      auVar71._16_4_ = auVar84._16_4_ * 0.0;
      auVar71._20_4_ = auVar84._20_4_ * 0.0;
      auVar71._24_4_ = auVar84._24_4_ * 0.0;
      auVar71._28_4_ = fVar197;
      auVar72._4_4_ = fVar207 * auVar85._4_4_;
      auVar72._0_4_ = fVar206 * auVar85._0_4_;
      auVar72._8_4_ = fVar209 * auVar85._8_4_;
      auVar72._12_4_ = fVar220 * auVar85._12_4_;
      auVar72._16_4_ = auVar85._16_4_ * 0.0;
      auVar72._20_4_ = auVar85._20_4_ * 0.0;
      auVar72._24_4_ = auVar85._24_4_ * 0.0;
      auVar72._28_4_ = auVar86._28_4_;
      auVar45 = vfmadd231ps_fma(auVar71,auVar88,ZEXT1632(auVar45));
      auVar49 = vfmadd231ps_fma(auVar72,auVar88,ZEXT1632(auVar49));
      auVar76._0_4_ = fVar206 * auVar73._0_4_;
      auVar76._4_4_ = fVar207 * auVar73._4_4_;
      auVar76._8_4_ = fVar209 * auVar73._8_4_;
      auVar76._12_4_ = fVar220 * auVar73._12_4_;
      auVar76._16_4_ = auVar73._16_4_ * 0.0;
      auVar76._20_4_ = auVar73._20_4_ * 0.0;
      auVar76._24_4_ = auVar73._24_4_ * 0.0;
      auVar76._28_4_ = 0;
      auVar86._4_4_ = fVar207 * auVar74._4_4_;
      auVar86._0_4_ = fVar206 * auVar74._0_4_;
      auVar86._8_4_ = fVar209 * auVar74._8_4_;
      auVar86._12_4_ = fVar220 * auVar74._12_4_;
      auVar86._16_4_ = auVar74._16_4_ * 0.0;
      auVar86._20_4_ = auVar74._20_4_ * 0.0;
      auVar86._24_4_ = auVar74._24_4_ * 0.0;
      auVar86._28_4_ = auVar73._28_4_;
      auVar50 = vfmadd231ps_fma(auVar76,auVar88,auVar84);
      auVar54 = vfmadd231ps_fma(auVar86,auVar88,auVar85);
      auVar73._28_4_ = auVar85._28_4_;
      auVar73._0_28_ =
           ZEXT1628(CONCAT412(fVar220 * auVar54._12_4_,
                              CONCAT48(fVar209 * auVar54._8_4_,
                                       CONCAT44(fVar207 * auVar54._4_4_,fVar206 * auVar54._0_4_))));
      auVar55 = vfmadd231ps_fma(ZEXT1632(CONCAT412(fVar220 * auVar50._12_4_,
                                                   CONCAT48(fVar209 * auVar50._8_4_,
                                                            CONCAT44(fVar207 * auVar50._4_4_,
                                                                     fVar206 * auVar50._0_4_)))),
                                auVar88,ZEXT1632(auVar45));
      auVar63 = vfmadd231ps_fma(auVar73,auVar88,ZEXT1632(auVar49));
      auVar86 = vsubps_avx(ZEXT1632(auVar50),ZEXT1632(auVar45));
      auVar71 = vsubps_avx(ZEXT1632(auVar54),ZEXT1632(auVar49));
      auVar72 = vbroadcastss_avx512vl(ZEXT416(0x40400000));
      auVar86 = vmulps_avx512vl(auVar86,auVar72);
      auVar71 = vmulps_avx512vl(auVar71,auVar72);
      auVar84._0_4_ = fVar208 * auVar86._0_4_;
      auVar84._4_4_ = fVar208 * auVar86._4_4_;
      auVar84._8_4_ = fVar208 * auVar86._8_4_;
      auVar84._12_4_ = fVar208 * auVar86._12_4_;
      auVar84._16_4_ = fVar208 * auVar86._16_4_;
      auVar84._20_4_ = fVar208 * auVar86._20_4_;
      auVar84._24_4_ = fVar208 * auVar86._24_4_;
      auVar84._28_4_ = 0;
      auVar86 = vmulps_avx512vl(auVar90,auVar71);
      auVar49 = vxorps_avx512vl(auVar75._0_16_,auVar75._0_16_);
      auVar71 = vpermt2ps_avx512vl(ZEXT1632(auVar55),_DAT_01feed00,ZEXT1632(auVar49));
      auVar73 = vpermt2ps_avx512vl(ZEXT1632(auVar63),_DAT_01feed00,ZEXT1632(auVar49));
      auVar127._0_4_ = auVar84._0_4_ + auVar55._0_4_;
      auVar127._4_4_ = auVar84._4_4_ + auVar55._4_4_;
      auVar127._8_4_ = auVar84._8_4_ + auVar55._8_4_;
      auVar127._12_4_ = auVar84._12_4_ + auVar55._12_4_;
      auVar127._16_4_ = auVar84._16_4_ + 0.0;
      auVar127._20_4_ = auVar84._20_4_ + 0.0;
      auVar127._24_4_ = auVar84._24_4_ + 0.0;
      auVar127._28_4_ = 0;
      auVar85 = ZEXT1632(auVar49);
      auVar74 = vpermt2ps_avx512vl(auVar84,_DAT_01feed00,auVar85);
      auVar75 = vaddps_avx512vl(ZEXT1632(auVar63),auVar86);
      auVar76 = vpermt2ps_avx512vl(auVar86,_DAT_01feed00,auVar85);
      auVar86 = vsubps_avx(auVar71,auVar74);
      auVar76 = vsubps_avx512vl(auVar73,auVar76);
      auVar74 = vmulps_avx512vl(auVar80,auVar89);
      auVar84 = vmulps_avx512vl(auVar81,auVar89);
      auVar74 = vfmadd231ps_avx512vl(auVar74,auVar88,auVar77);
      auVar77 = vfmadd231ps_avx512vl(auVar84,auVar88,auVar79);
      auVar79 = vmulps_avx512vl(auVar87,auVar89);
      auVar84 = vmulps_avx512vl(auVar82,auVar89);
      auVar79 = vfmadd231ps_avx512vl(auVar79,auVar88,auVar80);
      auVar80 = vfmadd231ps_avx512vl(auVar84,auVar88,auVar81);
      auVar81 = vmulps_avx512vl(auVar83,auVar89);
      auVar78 = vmulps_avx512vl(auVar78,auVar89);
      auVar45 = vfmadd231ps_fma(auVar81,auVar88,auVar87);
      auVar87 = vfmadd231ps_avx512vl(auVar78,auVar88,auVar82);
      auVar78 = vmulps_avx512vl(auVar89,auVar79);
      auVar83 = ZEXT1632(auVar70);
      auVar81 = vmulps_avx512vl(auVar83,auVar80);
      auVar74 = vfmadd231ps_avx512vl(auVar78,auVar88,auVar74);
      auVar77 = vfmadd231ps_avx512vl(auVar81,auVar88,auVar77);
      auVar87 = vmulps_avx512vl(auVar83,auVar87);
      auVar78 = vfmadd231ps_avx512vl
                          (ZEXT1632(CONCAT412(fVar220 * auVar45._12_4_,
                                              CONCAT48(fVar209 * auVar45._8_4_,
                                                       CONCAT44(fVar207 * auVar45._4_4_,
                                                                fVar206 * auVar45._0_4_)))),auVar88,
                           auVar79);
      auVar79 = vfmadd231ps_avx512vl(auVar87,auVar88,auVar80);
      auVar87._4_4_ = fVar207 * auVar78._4_4_;
      auVar87._0_4_ = fVar206 * auVar78._0_4_;
      auVar87._8_4_ = fVar209 * auVar78._8_4_;
      auVar87._12_4_ = fVar220 * auVar78._12_4_;
      auVar87._16_4_ = auVar78._16_4_ * 0.0;
      auVar87._20_4_ = auVar78._20_4_ * 0.0;
      auVar87._24_4_ = auVar78._24_4_ * 0.0;
      auVar87._28_4_ = auVar82._28_4_;
      auVar80 = vmulps_avx512vl(auVar83,auVar79);
      auVar87 = vfmadd231ps_avx512vl(auVar87,auVar88,auVar74);
      auVar80 = vfmadd231ps_avx512vl(auVar80,auVar77,auVar88);
      auVar88 = vsubps_avx512vl(auVar78,auVar74);
      auVar74 = vsubps_avx512vl(auVar79,auVar77);
      auVar77 = vmulps_avx512vl(auVar88,auVar72);
      auVar72 = vmulps_avx512vl(auVar74,auVar72);
      fVar197 = fVar208 * auVar77._0_4_;
      fVar206 = fVar208 * auVar77._4_4_;
      auVar88._4_4_ = fVar206;
      auVar88._0_4_ = fVar197;
      fVar207 = fVar208 * auVar77._8_4_;
      auVar88._8_4_ = fVar207;
      fVar209 = fVar208 * auVar77._12_4_;
      auVar88._12_4_ = fVar209;
      fVar220 = fVar208 * auVar77._16_4_;
      auVar88._16_4_ = fVar220;
      fVar221 = fVar208 * auVar77._20_4_;
      auVar88._20_4_ = fVar221;
      fVar208 = fVar208 * auVar77._24_4_;
      auVar88._24_4_ = fVar208;
      auVar88._28_4_ = auVar77._28_4_;
      auVar72 = vmulps_avx512vl(auVar90,auVar72);
      auVar78 = vpermt2ps_avx512vl(auVar87,_DAT_01feed00,auVar85);
      auVar79 = vpermt2ps_avx512vl(auVar80,_DAT_01feed00,auVar85);
      auVar196._0_4_ = auVar87._0_4_ + fVar197;
      auVar196._4_4_ = auVar87._4_4_ + fVar206;
      auVar196._8_4_ = auVar87._8_4_ + fVar207;
      auVar196._12_4_ = auVar87._12_4_ + fVar209;
      auVar196._16_4_ = auVar87._16_4_ + fVar220;
      auVar196._20_4_ = auVar87._20_4_ + fVar221;
      auVar196._24_4_ = auVar87._24_4_ + fVar208;
      auVar196._28_4_ = auVar87._28_4_ + auVar77._28_4_;
      auVar88 = vpermt2ps_avx512vl(auVar88,_DAT_01feed00,ZEXT1632(auVar49));
      auVar77 = vaddps_avx512vl(auVar80,auVar72);
      auVar72 = vpermt2ps_avx512vl(auVar72,_DAT_01feed00,ZEXT1632(auVar49));
      auVar88 = vsubps_avx(auVar78,auVar88);
      auVar72 = vsubps_avx512vl(auVar79,auVar72);
      auVar92 = ZEXT1632(auVar55);
      auVar74 = vsubps_avx512vl(auVar87,auVar92);
      auVar94 = ZEXT1632(auVar63);
      auVar81 = vsubps_avx512vl(auVar80,auVar94);
      auVar82 = vsubps_avx512vl(auVar78,auVar71);
      auVar74 = vaddps_avx512vl(auVar74,auVar82);
      auVar82 = vsubps_avx512vl(auVar79,auVar73);
      auVar81 = vaddps_avx512vl(auVar81,auVar82);
      auVar82 = vmulps_avx512vl(auVar94,auVar74);
      auVar82 = vfnmadd231ps_avx512vl(auVar82,auVar92,auVar81);
      auVar83 = vmulps_avx512vl(auVar75,auVar74);
      auVar83 = vfnmadd231ps_avx512vl(auVar83,auVar127,auVar81);
      auVar84 = vmulps_avx512vl(auVar76,auVar74);
      auVar84 = vfnmadd231ps_avx512vl(auVar84,auVar86,auVar81);
      auVar85 = vmulps_avx512vl(auVar73,auVar74);
      auVar85 = vfnmadd231ps_avx512vl(auVar85,auVar71,auVar81);
      auVar89 = vmulps_avx512vl(auVar80,auVar74);
      auVar89 = vfnmadd231ps_avx512vl(auVar89,auVar87,auVar81);
      auVar90 = vmulps_avx512vl(auVar77,auVar74);
      auVar90 = vfnmadd231ps_avx512vl(auVar90,auVar196,auVar81);
      auVar91 = vmulps_avx512vl(auVar72,auVar74);
      auVar91 = vfnmadd231ps_avx512vl(auVar91,auVar88,auVar81);
      auVar74 = vmulps_avx512vl(auVar79,auVar74);
      auVar74 = vfnmadd231ps_avx512vl(auVar74,auVar78,auVar81);
      auVar81 = vminps_avx512vl(auVar82,auVar83);
      auVar82 = vmaxps_avx512vl(auVar82,auVar83);
      auVar83 = vminps_avx512vl(auVar84,auVar85);
      auVar81 = vminps_avx512vl(auVar81,auVar83);
      auVar83 = vmaxps_avx512vl(auVar84,auVar85);
      auVar82 = vmaxps_avx512vl(auVar82,auVar83);
      auVar83 = vminps_avx512vl(auVar89,auVar90);
      auVar84 = vmaxps_avx512vl(auVar89,auVar90);
      auVar85 = vminps_avx512vl(auVar91,auVar74);
      auVar83 = vminps_avx512vl(auVar83,auVar85);
      auVar81 = vminps_avx512vl(auVar81,auVar83);
      auVar74 = vmaxps_avx512vl(auVar91,auVar74);
      auVar74 = vmaxps_avx512vl(auVar84,auVar74);
      auVar82 = vmaxps_avx512vl(auVar82,auVar74);
      uVar13 = vcmpps_avx512vl(auVar81,local_260,2);
      auVar74._4_4_ = uStack_1bc;
      auVar74._0_4_ = local_1c0;
      auVar74._8_4_ = uStack_1b8;
      auVar74._12_4_ = uStack_1b4;
      auVar74._16_4_ = uStack_1b0;
      auVar74._20_4_ = uStack_1ac;
      auVar74._24_4_ = uStack_1a8;
      auVar74._28_4_ = uStack_1a4;
      uVar14 = vcmpps_avx512vl(auVar82,auVar74,5);
      bVar26 = (byte)uVar13 & (byte)uVar14 & 0x7f;
      if (bVar26 != 0) {
        auVar81 = vsubps_avx512vl(auVar71,auVar92);
        auVar82 = vsubps_avx512vl(auVar73,auVar94);
        auVar83 = vsubps_avx512vl(auVar78,auVar87);
        auVar81 = vaddps_avx512vl(auVar81,auVar83);
        auVar83 = vsubps_avx512vl(auVar79,auVar80);
        auVar82 = vaddps_avx512vl(auVar82,auVar83);
        auVar83 = vmulps_avx512vl(auVar94,auVar81);
        auVar83 = vfnmadd231ps_avx512vl(auVar83,auVar82,auVar92);
        auVar75 = vmulps_avx512vl(auVar75,auVar81);
        auVar75 = vfnmadd213ps_avx512vl(auVar127,auVar82,auVar75);
        auVar76 = vmulps_avx512vl(auVar76,auVar81);
        auVar76 = vfnmadd213ps_avx512vl(auVar86,auVar82,auVar76);
        auVar86 = vmulps_avx512vl(auVar73,auVar81);
        auVar73 = vfnmadd231ps_avx512vl(auVar86,auVar82,auVar71);
        auVar86 = vmulps_avx512vl(auVar80,auVar81);
        auVar80 = vfnmadd231ps_avx512vl(auVar86,auVar82,auVar87);
        auVar86 = vmulps_avx512vl(auVar77,auVar81);
        auVar77 = vfnmadd213ps_avx512vl(auVar196,auVar82,auVar86);
        auVar86 = vmulps_avx512vl(auVar72,auVar81);
        auVar84 = vfnmadd213ps_avx512vl(auVar88,auVar82,auVar86);
        auVar88 = vmulps_avx512vl(auVar79,auVar81);
        auVar78 = vfnmadd231ps_avx512vl(auVar88,auVar78,auVar82);
        auVar86 = vminps_avx(auVar83,auVar75);
        auVar88 = vmaxps_avx(auVar83,auVar75);
        auVar71 = vminps_avx(auVar76,auVar73);
        auVar71 = vminps_avx(auVar86,auVar71);
        auVar86 = vmaxps_avx(auVar76,auVar73);
        auVar88 = vmaxps_avx(auVar88,auVar86);
        auVar87 = vminps_avx(auVar80,auVar77);
        auVar86 = vmaxps_avx(auVar80,auVar77);
        auVar72 = vminps_avx(auVar84,auVar78);
        auVar87 = vminps_avx(auVar87,auVar72);
        auVar87 = vminps_avx(auVar71,auVar87);
        auVar71 = vmaxps_avx(auVar84,auVar78);
        auVar86 = vmaxps_avx(auVar86,auVar71);
        auVar88 = vmaxps_avx(auVar88,auVar86);
        uVar13 = vcmpps_avx512vl(auVar88,auVar74,5);
        uVar14 = vcmpps_avx512vl(auVar87,local_260,2);
        bVar26 = bVar26 & (byte)uVar13 & (byte)uVar14;
        if (bVar26 != 0) {
          auStack_430[uVar28] = (uint)bVar26;
          uVar13 = vmovlps_avx(auVar41);
          (&uStack_240)[uVar28] = uVar13;
          uVar32 = vmovlps_avx(auVar68);
          auStack_1a0[uVar28] = uVar32;
          uVar28 = (ulong)((int)uVar28 + 1);
        }
      }
      auVar41 = vbroadcastss_avx512vl(ZEXT416(0x40400000));
      auVar239 = ZEXT1664(auVar41);
      auVar41 = vbroadcastss_avx512vl(ZEXT416(0x80000000));
      auVar240 = ZEXT1664(auVar41);
      auVar88 = vbroadcastss_avx512vl(ZEXT416(0x40400000));
      auVar241 = ZEXT3264(auVar88);
      auVar41 = vbroadcastss_avx512vl(ZEXT416(0x3e124925));
      auVar242 = ZEXT1664(auVar41);
      auVar243 = ZEXT3264(_DAT_01feed20);
      if ((int)uVar28 != 0) {
        do {
          auVar45 = auVar245._0_16_;
          auVar70 = auVar239._0_16_;
          uVar27 = (int)uVar28 - 1;
          uVar29 = (ulong)uVar27;
          uVar5 = auStack_430[uVar29];
          auVar68._8_8_ = 0;
          auVar68._0_8_ = auStack_1a0[uVar29];
          uVar32 = 0;
          for (uVar33 = (ulong)uVar5; (uVar33 & 1) == 0; uVar33 = uVar33 >> 1 | 0x8000000000000000)
          {
            uVar32 = uVar32 + 1;
          }
          uVar31 = uVar5 - 1 & uVar5;
          bVar37 = uVar31 == 0;
          auStack_430[uVar29] = uVar31;
          if (bVar37) {
            uVar28 = (ulong)uVar27;
          }
          auVar105._8_8_ = 0;
          auVar105._0_8_ = uVar32;
          auVar41 = vpunpcklqdq_avx(auVar105,ZEXT416((int)uVar32 + 1));
          auVar41 = vcvtqq2ps_avx512vl(auVar41);
          auVar41 = vmulps_avx512vl(auVar41,auVar242._0_16_);
          uVar110 = *(undefined4 *)((long)&uStack_240 + uVar29 * 8 + 4);
          auVar15._4_4_ = uVar110;
          auVar15._0_4_ = uVar110;
          auVar15._8_4_ = uVar110;
          auVar15._12_4_ = uVar110;
          auVar49 = vmulps_avx512vl(auVar41,auVar15);
          auVar41 = vsubps_avx512vl(auVar45,auVar41);
          uVar110 = *(undefined4 *)(&uStack_240 + uVar29);
          auVar16._4_4_ = uVar110;
          auVar16._0_4_ = uVar110;
          auVar16._8_4_ = uVar110;
          auVar16._12_4_ = uVar110;
          auVar41 = vfmadd231ps_avx512vl(auVar49,auVar41,auVar16);
          auVar49 = vmovshdup_avx(auVar41);
          fVar208 = auVar49._0_4_ - auVar41._0_4_;
          vucomiss_avx512f(ZEXT416((uint)fVar208));
          if (uVar5 == 0 || bVar37) goto LAB_01aaed17;
          auVar49 = vshufps_avx(auVar68,auVar68,0x50);
          vucomiss_avx512f(ZEXT416((uint)fVar208));
          uVar27 = (uint)uVar28;
          auVar55 = vsubps_avx512vl(auVar45,auVar49);
          fVar197 = auVar49._0_4_;
          auVar144._0_4_ = fVar197 * fVar135;
          fVar206 = auVar49._4_4_;
          auVar144._4_4_ = fVar206 * fVar140;
          fVar207 = auVar49._8_4_;
          auVar144._8_4_ = fVar207 * fVar135;
          fVar209 = auVar49._12_4_;
          auVar144._12_4_ = fVar209 * fVar140;
          auVar157._0_4_ = fVar197 * fVar141;
          auVar157._4_4_ = fVar206 * fVar150;
          auVar157._8_4_ = fVar207 * fVar141;
          auVar157._12_4_ = fVar209 * fVar150;
          auVar164._0_4_ = fVar197 * fVar109;
          auVar164._4_4_ = fVar206 * fVar116;
          auVar164._8_4_ = fVar207 * fVar109;
          auVar164._12_4_ = fVar209 * fVar116;
          auVar130._0_4_ = fVar197 * fVar117;
          auVar130._4_4_ = fVar206 * fVar118;
          auVar130._8_4_ = fVar207 * fVar117;
          auVar130._12_4_ = fVar209 * fVar118;
          auVar49 = vfmadd231ps_fma(auVar144,auVar55,auVar52);
          auVar50 = vfmadd231ps_fma(auVar157,auVar55,auVar48);
          auVar54 = vfmadd231ps_fma(auVar164,auVar55,auVar53);
          auVar55 = vfmadd231ps_fma(auVar130,auVar114,auVar55);
          auVar79._16_16_ = auVar49;
          auVar79._0_16_ = auVar49;
          auVar80._16_16_ = auVar50;
          auVar80._0_16_ = auVar50;
          auVar82._16_16_ = auVar54;
          auVar82._0_16_ = auVar54;
          auVar86 = vpermps_avx512vl(auVar243._0_32_,ZEXT1632(auVar41));
          auVar88 = vsubps_avx(auVar80,auVar79);
          auVar50 = vfmadd213ps_fma(auVar88,auVar86,auVar79);
          auVar88 = vsubps_avx(auVar82,auVar80);
          auVar63 = vfmadd213ps_fma(auVar88,auVar86,auVar80);
          auVar49 = vsubps_avx(auVar55,auVar54);
          auVar81._16_16_ = auVar49;
          auVar81._0_16_ = auVar49;
          auVar49 = vfmadd213ps_fma(auVar81,auVar86,auVar82);
          auVar88 = vsubps_avx(ZEXT1632(auVar63),ZEXT1632(auVar50));
          auVar50 = vfmadd213ps_fma(auVar88,auVar86,ZEXT1632(auVar50));
          auVar88 = vsubps_avx(ZEXT1632(auVar49),ZEXT1632(auVar63));
          auVar49 = vfmadd213ps_fma(auVar88,auVar86,ZEXT1632(auVar63));
          auVar88 = vsubps_avx(ZEXT1632(auVar49),ZEXT1632(auVar50));
          auVar69 = vfmadd231ps_fma(ZEXT1632(auVar50),auVar88,auVar86);
          auVar88 = vmulps_avx512vl(auVar88,auVar241._0_32_);
          auVar78._16_16_ = auVar88._16_16_;
          auVar49 = vmulss_avx512f(ZEXT416((uint)fVar208),SUB6416(ZEXT464(0x3eaaaaab),0));
          fVar197 = auVar49._0_4_;
          auVar165._0_8_ =
               CONCAT44(auVar69._4_4_ + fVar197 * auVar88._4_4_,
                        auVar69._0_4_ + fVar197 * auVar88._0_4_);
          auVar165._8_4_ = auVar69._8_4_ + fVar197 * auVar88._8_4_;
          auVar165._12_4_ = auVar69._12_4_ + fVar197 * auVar88._12_4_;
          auVar145._0_4_ = fVar197 * auVar88._16_4_;
          auVar145._4_4_ = fVar197 * auVar88._20_4_;
          auVar145._8_4_ = fVar197 * auVar88._24_4_;
          auVar145._12_4_ = fVar197 * auVar88._28_4_;
          auVar62 = vsubps_avx((undefined1  [16])0x0,auVar145);
          auVar63 = vshufpd_avx(auVar69,auVar69,3);
          auVar65 = vshufpd_avx((undefined1  [16])0x0,(undefined1  [16])0x0,3);
          auVar49 = vsubps_avx(auVar63,auVar69);
          auVar50 = vsubps_avx(auVar65,(undefined1  [16])0x0);
          auVar183._0_4_ = auVar49._0_4_ + auVar50._0_4_;
          auVar183._4_4_ = auVar49._4_4_ + auVar50._4_4_;
          auVar183._8_4_ = auVar49._8_4_ + auVar50._8_4_;
          auVar183._12_4_ = auVar49._12_4_ + auVar50._12_4_;
          auVar49 = vshufps_avx(auVar69,auVar69,0xb1);
          auVar50 = vshufps_avx(auVar165,auVar165,0xb1);
          auVar54 = vshufps_avx(auVar62,auVar62,0xb1);
          auVar55 = vshufps_avx((undefined1  [16])0x0,(undefined1  [16])0x0,0xb1);
          auVar232._4_4_ = auVar183._0_4_;
          auVar232._0_4_ = auVar183._0_4_;
          auVar232._8_4_ = auVar183._0_4_;
          auVar232._12_4_ = auVar183._0_4_;
          auVar58 = vshufps_avx(auVar183,auVar183,0x55);
          fVar197 = auVar58._0_4_;
          auVar194._0_4_ = auVar49._0_4_ * fVar197;
          fVar206 = auVar58._4_4_;
          auVar194._4_4_ = auVar49._4_4_ * fVar206;
          fVar207 = auVar58._8_4_;
          auVar194._8_4_ = auVar49._8_4_ * fVar207;
          fVar209 = auVar58._12_4_;
          auVar194._12_4_ = auVar49._12_4_ * fVar209;
          auVar199._0_4_ = auVar50._0_4_ * fVar197;
          auVar199._4_4_ = auVar50._4_4_ * fVar206;
          auVar199._8_4_ = auVar50._8_4_ * fVar207;
          auVar199._12_4_ = auVar50._12_4_ * fVar209;
          auVar212._0_4_ = auVar54._0_4_ * fVar197;
          auVar212._4_4_ = auVar54._4_4_ * fVar206;
          auVar212._8_4_ = auVar54._8_4_ * fVar207;
          auVar212._12_4_ = auVar54._12_4_ * fVar209;
          auVar184._0_4_ = auVar55._0_4_ * fVar197;
          auVar184._4_4_ = auVar55._4_4_ * fVar206;
          auVar184._8_4_ = auVar55._8_4_ * fVar207;
          auVar184._12_4_ = auVar55._12_4_ * fVar209;
          auVar49 = vfmadd231ps_fma(auVar194,auVar232,auVar69);
          auVar50 = vfmadd231ps_fma(auVar199,auVar232,auVar165);
          auVar60 = vfmadd231ps_fma(auVar212,auVar232,auVar62);
          auVar61 = vfmadd231ps_fma(auVar184,(undefined1  [16])0x0,auVar232);
          auVar58 = vshufpd_avx(auVar49,auVar49,1);
          auVar59 = vshufpd_avx(auVar50,auVar50,1);
          auVar56 = vshufpd_avx512vl(auVar60,auVar60,1);
          auVar57 = vshufpd_avx512vl(auVar61,auVar61,1);
          auVar54 = vminss_avx(auVar49,auVar50);
          auVar49 = vmaxss_avx(auVar50,auVar49);
          auVar55 = vminss_avx(auVar60,auVar61);
          auVar50 = vmaxss_avx(auVar61,auVar60);
          auVar54 = vminss_avx(auVar54,auVar55);
          auVar49 = vmaxss_avx(auVar50,auVar49);
          auVar55 = vminss_avx(auVar58,auVar59);
          auVar50 = vmaxss_avx(auVar59,auVar58);
          auVar58 = vminss_avx512f(auVar56,auVar57);
          auVar59 = vmaxss_avx512f(auVar57,auVar56);
          auVar50 = vmaxss_avx(auVar59,auVar50);
          auVar55 = vminss_avx512f(auVar55,auVar58);
          vucomiss_avx512f(auVar54);
          fVar206 = auVar50._0_4_;
          fVar197 = auVar49._0_4_;
          if (uVar27 < 5) {
LAB_01aaf44c:
            auVar58 = vucomiss_avx512f(auVar55);
            bVar38 = fVar206 <= -0.0001;
            bVar36 = -0.0001 < fVar197;
            bVar35 = bVar38;
            if (!bVar38) goto LAB_01aaf492;
            uVar13 = vcmpps_avx512vl(auVar54,auVar58,5);
            uVar14 = vcmpps_avx512vl(auVar55,auVar58,5);
            uVar31 = (uint)uVar13 & (uint)uVar14;
            bVar10 = (uVar31 & 1) == 0;
            bVar38 = bVar36 && bVar10;
            bVar35 = bVar36 && (uVar31 & 1) == 0;
            if (bVar36 && bVar10) goto LAB_01aaf492;
          }
          else {
            bVar38 = fVar206 == -0.0001;
            bVar35 = NAN(fVar206);
            if (fVar206 <= -0.0001) goto LAB_01aaf44c;
LAB_01aaf492:
            auVar60 = auVar246._0_16_;
            vcmpss_avx512f(auVar54,auVar60,1);
            uVar13 = vcmpss_avx512f(auVar49,auVar60,1);
            bVar36 = (bool)((byte)uVar13 & 1);
            auVar78._0_16_ = auVar247._0_16_;
            auVar92._4_28_ = auVar78._4_28_;
            auVar92._0_4_ = (float)((uint)bVar36 * -0x40800000 + (uint)!bVar36 * auVar247._0_4_);
            vucomiss_avx512f(auVar92._0_16_);
            bVar35 = (bool)(!bVar38 | bVar35);
            bVar36 = bVar35 == false;
            auVar94._16_16_ = auVar78._16_16_;
            auVar94._0_16_ = SUB6416(ZEXT464(0x7f800000),0);
            auVar93._4_28_ = auVar94._4_28_;
            auVar93._0_4_ = (uint)bVar35 * auVar246._0_4_ + (uint)!bVar35 * 0x7f800000;
            auVar59 = auVar93._0_16_;
            auVar96._16_16_ = auVar78._16_16_;
            auVar96._0_16_ = SUB6416(ZEXT464(0xff800000),0);
            auVar95._4_28_ = auVar96._4_28_;
            auVar95._0_4_ = (uint)bVar35 * auVar246._0_4_ + (uint)!bVar35 * -0x800000;
            auVar58 = auVar95._0_16_;
            uVar13 = vcmpss_avx512f(auVar55,auVar60,1);
            bVar38 = (bool)((byte)uVar13 & 1);
            auVar98._16_16_ = auVar78._16_16_;
            auVar98._0_16_ = auVar247._0_16_;
            auVar97._4_28_ = auVar98._4_28_;
            auVar97._0_4_ = (float)((uint)bVar38 * -0x40800000 + (uint)!bVar38 * auVar247._0_4_);
            vucomiss_avx512f(auVar97._0_16_);
            if ((bVar35) || (bVar36)) {
              auVar55 = vucomiss_avx512f(auVar54);
              if ((bVar35) || (bVar36)) {
                auVar61 = vxorps_avx512vl(auVar54,auVar240._0_16_);
                auVar54 = vsubss_avx512f(auVar55,auVar54);
                auVar54 = vdivss_avx512f(auVar61,auVar54);
                auVar55 = vsubss_avx512f(ZEXT416(0x3f800000),auVar54);
                auVar55 = vfmadd213ss_avx512f(auVar55,auVar60,auVar54);
                auVar54 = auVar55;
              }
              else {
                auVar55 = vxorps_avx512vl(auVar55,auVar55);
                vucomiss_avx512f(auVar55);
                if ((bVar35) || (auVar54 = ZEXT416(0x3f800000), bVar36)) {
                  auVar55 = ZEXT416(0x7f800000);
                  auVar54 = SUB6416(ZEXT464(0xff800000),0);
                }
              }
              auVar59 = vminss_avx512f(auVar59,auVar55);
              auVar58 = vmaxss_avx(auVar54,auVar58);
            }
            auVar247 = ZEXT464(0x3f800000);
            uVar13 = vcmpss_avx512f(auVar50,auVar60,1);
            bVar38 = (bool)((byte)uVar13 & 1);
            auVar50 = auVar247._0_16_;
            fVar207 = (float)((uint)bVar38 * -0x40800000 + (uint)!bVar38 * 0x3f800000);
            if ((auVar92._0_4_ != fVar207) || (NAN(auVar92._0_4_) || NAN(fVar207))) {
              if ((fVar206 != fVar197) || (NAN(fVar206) || NAN(fVar197))) {
                auVar49 = vxorps_avx512vl(auVar49,auVar240._0_16_);
                auVar185._0_4_ = auVar49._0_4_ / (fVar206 - fVar197);
                auVar185._4_12_ = auVar49._4_12_;
                auVar49 = vsubss_avx512f(auVar50,auVar185);
                auVar49 = vfmadd213ss_avx512f(auVar49,auVar60,auVar185);
                auVar54 = auVar49;
              }
              else if ((fVar197 != 0.0) ||
                      (auVar49 = auVar50, auVar54 = SUB6416(ZEXT864(0),0) << 0x20, NAN(fVar197))) {
                auVar49 = SUB6416(ZEXT464(0xff800000),0);
                auVar54 = SUB6416(ZEXT464(0x7f800000),0);
              }
              auVar59 = vminss_avx(auVar59,auVar54);
              auVar58 = vmaxss_avx(auVar49,auVar58);
            }
            bVar38 = auVar97._0_4_ != fVar207;
            auVar49 = vminss_avx512f(auVar59,auVar50);
            auVar100._16_16_ = auVar78._16_16_;
            auVar100._0_16_ = auVar59;
            auVar99._4_28_ = auVar100._4_28_;
            auVar99._0_4_ = (uint)bVar38 * auVar49._0_4_ + (uint)!bVar38 * auVar59._0_4_;
            auVar49 = vmaxss_avx512f(auVar50,auVar58);
            auVar102._16_16_ = auVar78._16_16_;
            auVar102._0_16_ = auVar58;
            auVar101._4_28_ = auVar102._4_28_;
            auVar101._0_4_ = (uint)bVar38 * auVar49._0_4_ + (uint)!bVar38 * auVar58._0_4_;
            auVar49 = vmaxss_avx512f(auVar60,auVar99._0_16_);
            auVar54 = vminss_avx512f(auVar101._0_16_,auVar50);
            if (auVar49._0_4_ <= auVar54._0_4_) {
              auVar60 = vmaxss_avx512f(auVar60,ZEXT416((uint)(auVar49._0_4_ + -0.1)));
              auVar61 = vminss_avx512f(ZEXT416((uint)(auVar54._0_4_ + 0.1)),auVar50);
              auVar131._0_8_ = auVar69._0_8_;
              auVar131._8_8_ = auVar131._0_8_;
              auVar200._8_8_ = auVar165._0_8_;
              auVar200._0_8_ = auVar165._0_8_;
              auVar213._8_8_ = auVar62._0_8_;
              auVar213._0_8_ = auVar62._0_8_;
              auVar49 = vshufpd_avx(auVar165,auVar165,3);
              auVar54 = vshufpd_avx(auVar62,auVar62,3);
              auVar55 = vshufps_avx(auVar60,auVar61,0);
              auVar62 = vsubps_avx512vl(auVar45,auVar55);
              fVar197 = auVar55._0_4_;
              auVar158._0_4_ = fVar197 * auVar63._0_4_;
              fVar206 = auVar55._4_4_;
              auVar158._4_4_ = fVar206 * auVar63._4_4_;
              fVar207 = auVar55._8_4_;
              auVar158._8_4_ = fVar207 * auVar63._8_4_;
              fVar209 = auVar55._12_4_;
              auVar158._12_4_ = fVar209 * auVar63._12_4_;
              auVar166._0_4_ = fVar197 * auVar49._0_4_;
              auVar166._4_4_ = fVar206 * auVar49._4_4_;
              auVar166._8_4_ = fVar207 * auVar49._8_4_;
              auVar166._12_4_ = fVar209 * auVar49._12_4_;
              auVar234._0_4_ = auVar54._0_4_ * fVar197;
              auVar234._4_4_ = auVar54._4_4_ * fVar206;
              auVar234._8_4_ = auVar54._8_4_ * fVar207;
              auVar234._12_4_ = auVar54._12_4_ * fVar209;
              auVar146._0_4_ = fVar197 * auVar65._0_4_;
              auVar146._4_4_ = fVar206 * auVar65._4_4_;
              auVar146._8_4_ = fVar207 * auVar65._8_4_;
              auVar146._12_4_ = fVar209 * auVar65._12_4_;
              auVar65 = vfmadd231ps_fma(auVar158,auVar62,auVar131);
              auVar58 = vfmadd231ps_fma(auVar166,auVar62,auVar200);
              auVar59 = vfmadd231ps_fma(auVar234,auVar62,auVar213);
              auVar62 = vfmadd231ps_fma(auVar146,auVar62,ZEXT816(0));
              auVar54 = vsubss_avx512f(auVar50,auVar60);
              auVar49 = vmovshdup_avx(auVar68);
              auVar56 = vfmadd231ss_fma(ZEXT416((uint)(auVar49._0_4_ * auVar60._0_4_)),auVar68,
                                        auVar54);
              auVar54 = vsubss_avx512f(auVar50,auVar61);
              auVar57 = vfmadd231ss_fma(ZEXT416((uint)(auVar49._0_4_ * auVar61._0_4_)),auVar68,
                                        auVar54);
              auVar60 = vdivss_avx512f(auVar50,ZEXT416((uint)fVar208));
              auVar49 = vsubps_avx(auVar58,auVar65);
              auVar55 = vmulps_avx512vl(auVar49,auVar70);
              auVar49 = vsubps_avx(auVar59,auVar58);
              auVar63 = vmulps_avx512vl(auVar49,auVar70);
              auVar49 = vsubps_avx(auVar62,auVar59);
              auVar49 = vmulps_avx512vl(auVar49,auVar70);
              auVar54 = vminps_avx(auVar63,auVar49);
              auVar49 = vmaxps_avx(auVar63,auVar49);
              auVar54 = vminps_avx(auVar55,auVar54);
              auVar49 = vmaxps_avx(auVar55,auVar49);
              auVar55 = vshufpd_avx(auVar54,auVar54,3);
              auVar63 = vshufpd_avx(auVar49,auVar49,3);
              auVar54 = vminps_avx(auVar54,auVar55);
              auVar49 = vmaxps_avx(auVar49,auVar63);
              fVar208 = auVar60._0_4_;
              auVar186._0_4_ = auVar54._0_4_ * fVar208;
              auVar186._4_4_ = auVar54._4_4_ * fVar208;
              auVar186._8_4_ = auVar54._8_4_ * fVar208;
              auVar186._12_4_ = auVar54._12_4_ * fVar208;
              auVar173._0_4_ = fVar208 * auVar49._0_4_;
              auVar173._4_4_ = fVar208 * auVar49._4_4_;
              auVar173._8_4_ = fVar208 * auVar49._8_4_;
              auVar173._12_4_ = fVar208 * auVar49._12_4_;
              auVar60 = vdivss_avx512f(auVar50,ZEXT416((uint)(auVar57._0_4_ - auVar56._0_4_)));
              auVar49 = vshufpd_avx(auVar65,auVar65,3);
              auVar54 = vshufpd_avx(auVar58,auVar58,3);
              auVar55 = vshufpd_avx(auVar59,auVar59,3);
              auVar63 = vshufpd_avx(auVar62,auVar62,3);
              auVar49 = vsubps_avx(auVar49,auVar65);
              auVar65 = vsubps_avx(auVar54,auVar58);
              auVar58 = vsubps_avx(auVar55,auVar59);
              auVar63 = vsubps_avx(auVar63,auVar62);
              auVar54 = vminps_avx(auVar49,auVar65);
              auVar49 = vmaxps_avx(auVar49,auVar65);
              auVar55 = vminps_avx(auVar58,auVar63);
              auVar55 = vminps_avx(auVar54,auVar55);
              auVar54 = vmaxps_avx(auVar58,auVar63);
              auVar49 = vmaxps_avx(auVar49,auVar54);
              fVar208 = auVar60._0_4_;
              auVar214._0_4_ = fVar208 * auVar55._0_4_;
              auVar214._4_4_ = fVar208 * auVar55._4_4_;
              auVar214._8_4_ = fVar208 * auVar55._8_4_;
              auVar214._12_4_ = fVar208 * auVar55._12_4_;
              auVar201._0_4_ = fVar208 * auVar49._0_4_;
              auVar201._4_4_ = fVar208 * auVar49._4_4_;
              auVar201._8_4_ = fVar208 * auVar49._8_4_;
              auVar201._12_4_ = fVar208 * auVar49._12_4_;
              auVar63 = vinsertps_avx(auVar41,auVar56,0x10);
              auVar64 = vpermt2ps_avx512vl(auVar41,_DAT_01feecd0,auVar57);
              auVar115._0_4_ = auVar63._0_4_ + auVar64._0_4_;
              auVar115._4_4_ = auVar63._4_4_ + auVar64._4_4_;
              auVar115._8_4_ = auVar63._8_4_ + auVar64._8_4_;
              auVar115._12_4_ = auVar63._12_4_ + auVar64._12_4_;
              auVar17._8_4_ = 0x3f000000;
              auVar17._0_8_ = 0x3f0000003f000000;
              auVar17._12_4_ = 0x3f000000;
              auVar60 = vmulps_avx512vl(auVar115,auVar17);
              auVar54 = vshufps_avx(auVar60,auVar60,0x54);
              uVar110 = auVar60._0_4_;
              auVar125._4_4_ = uVar110;
              auVar125._0_4_ = uVar110;
              auVar125._8_4_ = uVar110;
              auVar125._12_4_ = uVar110;
              auVar65 = vfmadd213ps_avx512vl(auVar40,auVar125,auVar42);
              auVar58 = vfmadd213ps_avx512vl(local_290,auVar125,auVar51);
              auVar55 = vfmadd213ps_fma(local_2a0,auVar125,local_440);
              auVar49 = vsubps_avx(auVar58,auVar65);
              auVar65 = vfmadd213ps_fma(auVar49,auVar125,auVar65);
              auVar49 = vsubps_avx(auVar55,auVar58);
              auVar49 = vfmadd213ps_fma(auVar49,auVar125,auVar58);
              auVar49 = vsubps_avx(auVar49,auVar65);
              auVar55 = vfmadd231ps_fma(auVar65,auVar49,auVar125);
              auVar59 = vmulps_avx512vl(auVar49,auVar70);
              auVar225._8_8_ = auVar55._0_8_;
              auVar225._0_8_ = auVar55._0_8_;
              auVar49 = vshufpd_avx(auVar55,auVar55,3);
              auVar55 = vshufps_avx(auVar60,auVar60,0x55);
              auVar65 = vsubps_avx(auVar49,auVar225);
              auVar58 = vfmadd231ps_fma(auVar225,auVar55,auVar65);
              auVar235._8_8_ = auVar59._0_8_;
              auVar235._0_8_ = auVar59._0_8_;
              auVar49 = vshufpd_avx(auVar59,auVar59,3);
              auVar49 = vsubps_avx512vl(auVar49,auVar235);
              auVar49 = vfmadd213ps_avx512vl(auVar49,auVar55,auVar235);
              auVar126._0_8_ = auVar65._0_8_ ^ 0x8000000080000000;
              auVar126._8_4_ = auVar65._8_4_ ^ 0x80000000;
              auVar126._12_4_ = auVar65._12_4_ ^ 0x80000000;
              auVar55 = vmovshdup_avx512vl(auVar49);
              auVar236._0_8_ = auVar55._0_8_ ^ 0x8000000080000000;
              auVar236._8_4_ = auVar55._8_4_ ^ 0x80000000;
              auVar236._12_4_ = auVar55._12_4_ ^ 0x80000000;
              auVar59 = vmovshdup_avx512vl(auVar65);
              auVar62 = vpermt2ps_avx512vl(auVar236,ZEXT416(5),auVar65);
              auVar66 = vxorps_avx512vl(ZEXT416(5),ZEXT416(5));
              auVar246 = ZEXT1664(auVar66);
              auVar55 = vfmsub231ss_avx512f(ZEXT416((uint)(auVar55._0_4_ * auVar65._0_4_)),auVar49,
                                            auVar59);
              auVar65 = vpermt2ps_avx512vl(auVar49,SUB6416(ZEXT464(4),0),auVar126);
              auVar147._0_4_ = auVar55._0_4_;
              auVar147._4_4_ = auVar147._0_4_;
              auVar147._8_4_ = auVar147._0_4_;
              auVar147._12_4_ = auVar147._0_4_;
              auVar49 = vdivps_avx(auVar62,auVar147);
              auVar67 = vdivps_avx512vl(auVar65,auVar147);
              fVar208 = auVar58._0_4_;
              auVar55 = vshufps_avx(auVar58,auVar58,0x55);
              auVar226._0_4_ = fVar208 * auVar49._0_4_ + auVar55._0_4_ * auVar67._0_4_;
              auVar226._4_4_ = fVar208 * auVar49._4_4_ + auVar55._4_4_ * auVar67._4_4_;
              auVar226._8_4_ = fVar208 * auVar49._8_4_ + auVar55._8_4_ * auVar67._8_4_;
              auVar226._12_4_ = fVar208 * auVar49._12_4_ + auVar55._12_4_ * auVar67._12_4_;
              auVar61 = vsubps_avx(auVar54,auVar226);
              auVar55 = vmovshdup_avx(auVar49);
              auVar54 = vinsertps_avx(auVar186,auVar214,0x1c);
              auVar237._0_4_ = auVar55._0_4_ * auVar54._0_4_;
              auVar237._4_4_ = auVar55._4_4_ * auVar54._4_4_;
              auVar237._8_4_ = auVar55._8_4_ * auVar54._8_4_;
              auVar237._12_4_ = auVar55._12_4_ * auVar54._12_4_;
              auVar69 = vinsertps_avx512f(auVar173,auVar201,0x1c);
              auVar55 = vmulps_avx512vl(auVar55,auVar69);
              auVar62 = vminps_avx512vl(auVar237,auVar55);
              auVar58 = vmaxps_avx(auVar55,auVar237);
              auVar59 = vmovshdup_avx(auVar67);
              auVar55 = vinsertps_avx(auVar214,auVar186,0x4c);
              auVar215._0_4_ = auVar59._0_4_ * auVar55._0_4_;
              auVar215._4_4_ = auVar59._4_4_ * auVar55._4_4_;
              auVar215._8_4_ = auVar59._8_4_ * auVar55._8_4_;
              auVar215._12_4_ = auVar59._12_4_ * auVar55._12_4_;
              auVar65 = vinsertps_avx(auVar201,auVar173,0x4c);
              auVar202._0_4_ = auVar59._0_4_ * auVar65._0_4_;
              auVar202._4_4_ = auVar59._4_4_ * auVar65._4_4_;
              auVar202._8_4_ = auVar59._8_4_ * auVar65._8_4_;
              auVar202._12_4_ = auVar59._12_4_ * auVar65._12_4_;
              auVar59 = vminps_avx(auVar215,auVar202);
              auVar62 = vaddps_avx512vl(auVar62,auVar59);
              auVar59 = vmaxps_avx(auVar202,auVar215);
              auVar203._0_4_ = auVar58._0_4_ + auVar59._0_4_;
              auVar203._4_4_ = auVar58._4_4_ + auVar59._4_4_;
              auVar203._8_4_ = auVar58._8_4_ + auVar59._8_4_;
              auVar203._12_4_ = auVar58._12_4_ + auVar59._12_4_;
              auVar216._8_8_ = 0x3f80000000000000;
              auVar216._0_8_ = 0x3f80000000000000;
              auVar58 = vsubps_avx(auVar216,auVar203);
              auVar59 = vsubps_avx(auVar216,auVar62);
              auVar62 = vsubps_avx(auVar63,auVar60);
              auVar60 = vsubps_avx(auVar64,auVar60);
              fVar209 = auVar62._0_4_;
              auVar238._0_4_ = fVar209 * auVar58._0_4_;
              fVar220 = auVar62._4_4_;
              auVar238._4_4_ = fVar220 * auVar58._4_4_;
              fVar221 = auVar62._8_4_;
              auVar238._8_4_ = fVar221 * auVar58._8_4_;
              fVar222 = auVar62._12_4_;
              auVar238._12_4_ = fVar222 * auVar58._12_4_;
              auVar68 = vbroadcastss_avx512vl(auVar49);
              auVar54 = vmulps_avx512vl(auVar68,auVar54);
              auVar69 = vmulps_avx512vl(auVar68,auVar69);
              auVar68 = vminps_avx512vl(auVar54,auVar69);
              auVar69 = vmaxps_avx512vl(auVar69,auVar54);
              auVar54 = vbroadcastss_avx512vl(auVar67);
              auVar55 = vmulps_avx512vl(auVar54,auVar55);
              auVar54 = vmulps_avx512vl(auVar54,auVar65);
              auVar65 = vminps_avx512vl(auVar55,auVar54);
              auVar65 = vaddps_avx512vl(auVar68,auVar65);
              auVar62 = vmulps_avx512vl(auVar62,auVar59);
              fVar208 = auVar60._0_4_;
              auVar204._0_4_ = fVar208 * auVar58._0_4_;
              fVar197 = auVar60._4_4_;
              auVar204._4_4_ = fVar197 * auVar58._4_4_;
              fVar206 = auVar60._8_4_;
              auVar204._8_4_ = fVar206 * auVar58._8_4_;
              fVar207 = auVar60._12_4_;
              auVar204._12_4_ = fVar207 * auVar58._12_4_;
              auVar217._0_4_ = fVar208 * auVar59._0_4_;
              auVar217._4_4_ = fVar197 * auVar59._4_4_;
              auVar217._8_4_ = fVar206 * auVar59._8_4_;
              auVar217._12_4_ = fVar207 * auVar59._12_4_;
              auVar54 = vmaxps_avx(auVar54,auVar55);
              auVar174._0_4_ = auVar69._0_4_ + auVar54._0_4_;
              auVar174._4_4_ = auVar69._4_4_ + auVar54._4_4_;
              auVar174._8_4_ = auVar69._8_4_ + auVar54._8_4_;
              auVar174._12_4_ = auVar69._12_4_ + auVar54._12_4_;
              auVar187._8_8_ = 0x3f800000;
              auVar187._0_8_ = 0x3f800000;
              auVar54 = vsubps_avx(auVar187,auVar174);
              auVar55 = vsubps_avx512vl(auVar187,auVar65);
              auVar233._0_4_ = fVar209 * auVar54._0_4_;
              auVar233._4_4_ = fVar220 * auVar54._4_4_;
              auVar233._8_4_ = fVar221 * auVar54._8_4_;
              auVar233._12_4_ = fVar222 * auVar54._12_4_;
              auVar227._0_4_ = fVar209 * auVar55._0_4_;
              auVar227._4_4_ = fVar220 * auVar55._4_4_;
              auVar227._8_4_ = fVar221 * auVar55._8_4_;
              auVar227._12_4_ = fVar222 * auVar55._12_4_;
              auVar175._0_4_ = fVar208 * auVar54._0_4_;
              auVar175._4_4_ = fVar197 * auVar54._4_4_;
              auVar175._8_4_ = fVar206 * auVar54._8_4_;
              auVar175._12_4_ = fVar207 * auVar54._12_4_;
              auVar188._0_4_ = fVar208 * auVar55._0_4_;
              auVar188._4_4_ = fVar197 * auVar55._4_4_;
              auVar188._8_4_ = fVar206 * auVar55._8_4_;
              auVar188._12_4_ = fVar207 * auVar55._12_4_;
              auVar54 = vminps_avx(auVar233,auVar227);
              auVar55 = vminps_avx512vl(auVar175,auVar188);
              auVar65 = vminps_avx512vl(auVar54,auVar55);
              auVar54 = vmaxps_avx(auVar227,auVar233);
              auVar55 = vmaxps_avx(auVar188,auVar175);
              auVar55 = vmaxps_avx(auVar55,auVar54);
              auVar58 = vminps_avx512vl(auVar238,auVar62);
              auVar54 = vminps_avx(auVar204,auVar217);
              auVar54 = vminps_avx(auVar58,auVar54);
              auVar54 = vhaddps_avx(auVar65,auVar54);
              auVar58 = vmaxps_avx512vl(auVar62,auVar238);
              auVar65 = vmaxps_avx(auVar217,auVar204);
              auVar65 = vmaxps_avx(auVar65,auVar58);
              auVar55 = vhaddps_avx(auVar55,auVar65);
              auVar54 = vshufps_avx(auVar54,auVar54,0xe8);
              auVar55 = vshufps_avx(auVar55,auVar55,0xe8);
              auVar176._0_4_ = auVar54._0_4_ + auVar61._0_4_;
              auVar176._4_4_ = auVar54._4_4_ + auVar61._4_4_;
              auVar176._8_4_ = auVar54._8_4_ + auVar61._8_4_;
              auVar176._12_4_ = auVar54._12_4_ + auVar61._12_4_;
              auVar189._0_4_ = auVar55._0_4_ + auVar61._0_4_;
              auVar189._4_4_ = auVar55._4_4_ + auVar61._4_4_;
              auVar189._8_4_ = auVar55._8_4_ + auVar61._8_4_;
              auVar189._12_4_ = auVar55._12_4_ + auVar61._12_4_;
              auVar54 = vmaxps_avx(auVar63,auVar176);
              auVar55 = vminps_avx(auVar189,auVar64);
              uVar32 = vcmpps_avx512vl(auVar55,auVar54,1);
              if ((uVar32 & 3) == 0) {
                uVar32 = vcmpps_avx512vl(auVar189,auVar64,1);
                uVar13 = vcmpps_avx512vl(auVar41,auVar176,1);
                if (((ushort)uVar13 & (ushort)uVar32 & 1) == 0) {
                  bVar26 = 0;
                }
                else {
                  auVar54 = vmovshdup_avx(auVar176);
                  bVar26 = auVar56._0_4_ < auVar54._0_4_ & (byte)(uVar32 >> 1) & 0x7f;
                }
                if (((3 < uVar27 || uVar5 != 0 && !bVar37) | bVar26) != 1) {
                  auVar68 = vinsertps_avx(auVar56,auVar57,0x10);
                  goto LAB_01aaed17;
                }
                lVar30 = 200;
                do {
                  auVar41 = vsubss_avx512f(auVar50,auVar61);
                  fVar206 = auVar41._0_4_;
                  fVar208 = fVar206 * fVar206 * fVar206;
                  fVar207 = auVar61._0_4_;
                  fVar197 = fVar207 * 3.0 * fVar206 * fVar206;
                  fVar206 = fVar206 * fVar207 * fVar207 * 3.0;
                  auVar137._4_4_ = fVar208;
                  auVar137._0_4_ = fVar208;
                  auVar137._8_4_ = fVar208;
                  auVar137._12_4_ = fVar208;
                  auVar132._4_4_ = fVar197;
                  auVar132._0_4_ = fVar197;
                  auVar132._8_4_ = fVar197;
                  auVar132._12_4_ = fVar197;
                  auVar106._4_4_ = fVar206;
                  auVar106._0_4_ = fVar206;
                  auVar106._8_4_ = fVar206;
                  auVar106._12_4_ = fVar206;
                  fVar207 = fVar207 * fVar207 * fVar207;
                  auVar159._0_4_ = fVar207 * (float)local_270._0_4_;
                  auVar159._4_4_ = fVar207 * (float)local_270._4_4_;
                  auVar159._8_4_ = fVar207 * fStack_268;
                  auVar159._12_4_ = fVar207 * fStack_264;
                  auVar41 = vfmadd231ps_fma(auVar159,local_440,auVar106);
                  auVar41 = vfmadd231ps_fma(auVar41,auVar51,auVar132);
                  auVar41 = vfmadd231ps_fma(auVar41,auVar42,auVar137);
                  auVar107._8_8_ = auVar41._0_8_;
                  auVar107._0_8_ = auVar41._0_8_;
                  auVar41 = vshufpd_avx(auVar41,auVar41,3);
                  auVar54 = vshufps_avx(auVar61,auVar61,0x55);
                  auVar41 = vsubps_avx(auVar41,auVar107);
                  auVar54 = vfmadd213ps_fma(auVar41,auVar54,auVar107);
                  fVar208 = auVar54._0_4_;
                  auVar41 = vshufps_avx(auVar54,auVar54,0x55);
                  auVar108._0_4_ = auVar49._0_4_ * fVar208 + auVar67._0_4_ * auVar41._0_4_;
                  auVar108._4_4_ = auVar49._4_4_ * fVar208 + auVar67._4_4_ * auVar41._4_4_;
                  auVar108._8_4_ = auVar49._8_4_ * fVar208 + auVar67._8_4_ * auVar41._8_4_;
                  auVar108._12_4_ = auVar49._12_4_ * fVar208 + auVar67._12_4_ * auVar41._12_4_;
                  auVar61 = vsubps_avx(auVar61,auVar108);
                  auVar41 = vandps_avx512vl(auVar54,auVar244._0_16_);
                  auVar54 = vprolq_avx512vl(auVar41,0x20);
                  auVar41 = vmaxss_avx(auVar54,auVar41);
                  bVar37 = (float)local_280._0_4_ < auVar41._0_4_;
                  if (auVar41._0_4_ < (float)local_280._0_4_) {
                    auVar41 = vucomiss_avx512f(auVar66);
                    if (bVar37) break;
                    auVar49 = vucomiss_avx512f(auVar41);
                    auVar247 = ZEXT1664(auVar49);
                    if (bVar37) break;
                    vmovshdup_avx(auVar41);
                    auVar49 = vucomiss_avx512f(auVar66);
                    if (bVar37) break;
                    auVar50 = vucomiss_avx512f(auVar49);
                    auVar247 = ZEXT1664(auVar50);
                    if (bVar37) break;
                    auVar54 = vinsertps_avx(ZEXT416((uint)pre->ray_space[k].vx.field_0.m128[2]),
                                            ZEXT416((uint)pre->ray_space[k].vy.field_0.m128[2]),0x1c
                                           );
                    auVar60 = vinsertps_avx(auVar54,ZEXT416((uint)pre->ray_space[k].vz.field_0.m128
                                                                  [2]),0x28);
                    auVar54 = vdpps_avx(auVar60,local_2b0,0x7f);
                    auVar55 = vdpps_avx(auVar60,local_2c0,0x7f);
                    auVar63 = vdpps_avx(auVar60,local_2d0,0x7f);
                    auVar65 = vdpps_avx(auVar60,local_2e0,0x7f);
                    auVar58 = vdpps_avx(auVar60,local_2f0,0x7f);
                    auVar59 = vdpps_avx(auVar60,local_300,0x7f);
                    auVar62 = vdpps_avx(auVar60,local_310,0x7f);
                    auVar60 = vdpps_avx(auVar60,local_320,0x7f);
                    auVar61 = vsubss_avx512f(auVar50,auVar49);
                    fVar207 = auVar49._0_4_;
                    auVar49 = vfmadd231ss_fma(ZEXT416((uint)(fVar207 * auVar58._0_4_)),auVar61,
                                              auVar54);
                    auVar54 = vfmadd231ss_fma(ZEXT416((uint)(auVar59._0_4_ * fVar207)),auVar61,
                                              auVar55);
                    auVar55 = vfmadd231ss_fma(ZEXT416((uint)(auVar62._0_4_ * fVar207)),auVar61,
                                              auVar63);
                    auVar63 = vfmadd231ss_fma(ZEXT416((uint)(fVar207 * auVar60._0_4_)),auVar61,
                                              auVar65);
                    auVar50 = vsubss_avx512f(auVar50,auVar41);
                    auVar167._0_4_ = auVar50._0_4_;
                    fVar208 = auVar167._0_4_ * auVar167._0_4_ * auVar167._0_4_;
                    local_120 = auVar41._0_4_;
                    fVar197 = local_120 * 3.0 * auVar167._0_4_ * auVar167._0_4_;
                    fVar206 = auVar167._0_4_ * local_120 * local_120 * 3.0;
                    fVar220 = local_120 * local_120 * local_120;
                    auVar50 = vfmadd231ss_fma(ZEXT416((uint)(fVar220 * auVar63._0_4_)),
                                              ZEXT416((uint)fVar206),auVar55);
                    auVar50 = vfmadd231ss_fma(auVar50,ZEXT416((uint)fVar197),auVar54);
                    auVar49 = vfmadd231ss_fma(auVar50,ZEXT416((uint)fVar208),auVar49);
                    fVar209 = auVar49._0_4_;
                    if ((fVar209 < fVar103) ||
                       (fVar221 = *(float *)(ray + k * 4 + 0x100), fVar221 < fVar209)) break;
                    auVar49 = vshufps_avx(auVar41,auVar41,0x55);
                    auVar54 = vsubps_avx512vl(auVar45,auVar49);
                    fVar222 = auVar49._0_4_;
                    auVar195._0_4_ = fVar222 * (float)local_340._0_4_;
                    fVar223 = auVar49._4_4_;
                    auVar195._4_4_ = fVar223 * (float)local_340._4_4_;
                    fVar228 = auVar49._8_4_;
                    auVar195._8_4_ = fVar228 * fStack_338;
                    fVar229 = auVar49._12_4_;
                    auVar195._12_4_ = fVar229 * fStack_334;
                    auVar205._0_4_ = fVar222 * (float)local_390._0_4_;
                    auVar205._4_4_ = fVar223 * (float)local_390._4_4_;
                    auVar205._8_4_ = fVar228 * fStack_388;
                    auVar205._12_4_ = fVar229 * fStack_384;
                    auVar218._0_4_ = fVar222 * (float)local_3a0._0_4_;
                    auVar218._4_4_ = fVar223 * (float)local_3a0._4_4_;
                    auVar218._8_4_ = fVar228 * fStack_398;
                    auVar218._12_4_ = fVar229 * fStack_394;
                    auVar177._0_4_ = fVar222 * (float)local_360._0_4_;
                    auVar177._4_4_ = fVar223 * (float)local_360._4_4_;
                    auVar177._8_4_ = fVar228 * fStack_358;
                    auVar177._12_4_ = fVar229 * fStack_354;
                    auVar45 = vfmadd231ps_fma(auVar195,auVar54,local_330);
                    auVar49 = vfmadd231ps_fma(auVar205,auVar54,local_370);
                    auVar50 = vfmadd231ps_fma(auVar218,auVar54,local_380);
                    auVar54 = vfmadd231ps_fma(auVar177,auVar54,local_350);
                    auVar45 = vsubps_avx(auVar49,auVar45);
                    auVar49 = vsubps_avx(auVar50,auVar49);
                    auVar50 = vsubps_avx(auVar54,auVar50);
                    auVar219._0_4_ = local_120 * auVar49._0_4_;
                    auVar219._4_4_ = local_120 * auVar49._4_4_;
                    auVar219._8_4_ = local_120 * auVar49._8_4_;
                    auVar219._12_4_ = local_120 * auVar49._12_4_;
                    auVar167._4_4_ = auVar167._0_4_;
                    auVar167._8_4_ = auVar167._0_4_;
                    auVar167._12_4_ = auVar167._0_4_;
                    auVar45 = vfmadd231ps_fma(auVar219,auVar167,auVar45);
                    auVar178._0_4_ = local_120 * auVar50._0_4_;
                    auVar178._4_4_ = local_120 * auVar50._4_4_;
                    auVar178._8_4_ = local_120 * auVar50._8_4_;
                    auVar178._12_4_ = local_120 * auVar50._12_4_;
                    auVar49 = vfmadd231ps_fma(auVar178,auVar167,auVar49);
                    auVar179._0_4_ = local_120 * auVar49._0_4_;
                    auVar179._4_4_ = local_120 * auVar49._4_4_;
                    auVar179._8_4_ = local_120 * auVar49._8_4_;
                    auVar179._12_4_ = local_120 * auVar49._12_4_;
                    auVar45 = vfmadd231ps_fma(auVar179,auVar167,auVar45);
                    auVar70 = vmulps_avx512vl(auVar45,auVar70);
                    pGVar6 = (context->scene->geometries).items[uVar34].ptr;
                    if ((pGVar6->mask & *(uint *)(ray + k * 4 + 0x120)) == 0) break;
                    auVar160._0_4_ = fVar220 * (float)local_3e0._0_4_;
                    auVar160._4_4_ = fVar220 * (float)local_3e0._4_4_;
                    auVar160._8_4_ = fVar220 * fStack_3d8;
                    auVar160._12_4_ = fVar220 * fStack_3d4;
                    auVar148._4_4_ = fVar206;
                    auVar148._0_4_ = fVar206;
                    auVar148._8_4_ = fVar206;
                    auVar148._12_4_ = fVar206;
                    auVar45 = vfmadd132ps_fma(auVar148,auVar160,local_3d0);
                    auVar138._4_4_ = fVar197;
                    auVar138._0_4_ = fVar197;
                    auVar138._8_4_ = fVar197;
                    auVar138._12_4_ = fVar197;
                    auVar45 = vfmadd132ps_fma(auVar138,auVar45,local_3c0);
                    auVar133._4_4_ = fVar208;
                    auVar133._0_4_ = fVar208;
                    auVar133._8_4_ = fVar208;
                    auVar133._12_4_ = fVar208;
                    auVar50 = vfmadd132ps_fma(auVar133,auVar45,local_3b0);
                    auVar45 = vshufps_avx(auVar50,auVar50,0xc9);
                    auVar49 = vshufps_avx(auVar70,auVar70,0xc9);
                    auVar134._0_4_ = auVar50._0_4_ * auVar49._0_4_;
                    auVar134._4_4_ = auVar50._4_4_ * auVar49._4_4_;
                    auVar134._8_4_ = auVar50._8_4_ * auVar49._8_4_;
                    auVar134._12_4_ = auVar50._12_4_ * auVar49._12_4_;
                    auVar70 = vfmsub231ps_fma(auVar134,auVar70,auVar45);
                    local_140 = auVar70._0_4_;
                    if ((context->args->filter == (RTCFilterFunctionN)0x0) &&
                       (pGVar6->intersectionFilterN == (RTCFilterFunctionN)0x0)) {
                      *(float *)(ray + k * 4 + 0x100) = fVar209;
                      uVar110 = vextractps_avx(auVar70,1);
                      *(undefined4 *)(ray + k * 4 + 0x180) = uVar110;
                      uVar110 = vextractps_avx(auVar70,2);
                      *(undefined4 *)(ray + k * 4 + 0x1a0) = uVar110;
                      *(undefined4 *)(ray + k * 4 + 0x1c0) = local_140;
                      *(float *)(ray + k * 4 + 0x1e0) = local_120;
                      *(float *)(ray + k * 4 + 0x200) = fVar207;
                      *(uint *)(ray + k * 4 + 0x220) = uVar4;
                      *(uint *)(ray + k * 4 + 0x240) = uVar34;
                      *(uint *)(ray + k * 4 + 0x260) = context->user->instID[0];
                      *(uint *)(ray + k * 4 + 0x280) = context->user->instPrimID[0];
                      break;
                    }
                    auVar139._8_4_ = 1;
                    auVar139._0_8_ = 0x100000001;
                    auVar139._12_4_ = 1;
                    auVar139._16_4_ = 1;
                    auVar139._20_4_ = 1;
                    auVar139._24_4_ = 1;
                    auVar139._28_4_ = 1;
                    local_100 = vpermps_avx2(auVar139,ZEXT1632(auVar41));
                    auVar88 = vpermps_avx2(auVar139,ZEXT1632(auVar70));
                    auVar149._8_4_ = 2;
                    auVar149._0_8_ = 0x200000002;
                    auVar149._12_4_ = 2;
                    auVar149._16_4_ = 2;
                    auVar149._20_4_ = 2;
                    auVar149._24_4_ = 2;
                    auVar149._28_4_ = 2;
                    local_160 = vpermps_avx2(auVar149,ZEXT1632(auVar70));
                    local_180[0] = (RTCHitN)auVar88[0];
                    local_180[1] = (RTCHitN)auVar88[1];
                    local_180[2] = (RTCHitN)auVar88[2];
                    local_180[3] = (RTCHitN)auVar88[3];
                    local_180[4] = (RTCHitN)auVar88[4];
                    local_180[5] = (RTCHitN)auVar88[5];
                    local_180[6] = (RTCHitN)auVar88[6];
                    local_180[7] = (RTCHitN)auVar88[7];
                    local_180[8] = (RTCHitN)auVar88[8];
                    local_180[9] = (RTCHitN)auVar88[9];
                    local_180[10] = (RTCHitN)auVar88[10];
                    local_180[0xb] = (RTCHitN)auVar88[0xb];
                    local_180[0xc] = (RTCHitN)auVar88[0xc];
                    local_180[0xd] = (RTCHitN)auVar88[0xd];
                    local_180[0xe] = (RTCHitN)auVar88[0xe];
                    local_180[0xf] = (RTCHitN)auVar88[0xf];
                    local_180[0x10] = (RTCHitN)auVar88[0x10];
                    local_180[0x11] = (RTCHitN)auVar88[0x11];
                    local_180[0x12] = (RTCHitN)auVar88[0x12];
                    local_180[0x13] = (RTCHitN)auVar88[0x13];
                    local_180[0x14] = (RTCHitN)auVar88[0x14];
                    local_180[0x15] = (RTCHitN)auVar88[0x15];
                    local_180[0x16] = (RTCHitN)auVar88[0x16];
                    local_180[0x17] = (RTCHitN)auVar88[0x17];
                    local_180[0x18] = (RTCHitN)auVar88[0x18];
                    local_180[0x19] = (RTCHitN)auVar88[0x19];
                    local_180[0x1a] = (RTCHitN)auVar88[0x1a];
                    local_180[0x1b] = (RTCHitN)auVar88[0x1b];
                    local_180[0x1c] = (RTCHitN)auVar88[0x1c];
                    local_180[0x1d] = (RTCHitN)auVar88[0x1d];
                    local_180[0x1e] = (RTCHitN)auVar88[0x1e];
                    local_180[0x1f] = (RTCHitN)auVar88[0x1f];
                    uStack_13c = local_140;
                    uStack_138 = local_140;
                    uStack_134 = local_140;
                    uStack_130 = local_140;
                    uStack_12c = local_140;
                    uStack_128 = local_140;
                    uStack_124 = local_140;
                    fStack_11c = local_120;
                    fStack_118 = local_120;
                    fStack_114 = local_120;
                    fStack_110 = local_120;
                    fStack_10c = local_120;
                    fStack_108 = local_120;
                    fStack_104 = local_120;
                    local_e0 = local_200._0_8_;
                    uStack_d8 = local_200._8_8_;
                    uStack_d0 = local_200._16_8_;
                    uStack_c8 = local_200._24_8_;
                    local_c0 = local_1e0;
                    vpcmpeqd_avx2(local_1e0,local_1e0);
                    uStack_9c = context->user->instID[0];
                    local_a0 = uStack_9c;
                    uStack_98 = uStack_9c;
                    uStack_94 = uStack_9c;
                    uStack_90 = uStack_9c;
                    uStack_8c = uStack_9c;
                    uStack_88 = uStack_9c;
                    uStack_84 = uStack_9c;
                    uStack_7c = context->user->instPrimID[0];
                    local_80 = uStack_7c;
                    uStack_78 = uStack_7c;
                    uStack_74 = uStack_7c;
                    uStack_70 = uStack_7c;
                    uStack_6c = uStack_7c;
                    uStack_68 = uStack_7c;
                    uStack_64 = uStack_7c;
                    *(float *)(ray + k * 4 + 0x100) = fVar209;
                    local_420 = local_220;
                    local_470.valid = (int *)local_420;
                    local_470.geometryUserPtr = pGVar6->userPtr;
                    local_470.context = context->user;
                    local_470.hit = local_180;
                    local_470.N = 8;
                    local_470.ray = (RTCRayN *)ray;
                    if (pGVar6->intersectionFilterN != (RTCFilterFunctionN)0x0) {
                      (*pGVar6->intersectionFilterN)(&local_470);
                      auVar41 = vxorps_avx512vl(auVar66,auVar66);
                      auVar246 = ZEXT1664(auVar41);
                      auVar247 = ZEXT464(0x3f800000);
                      auVar243 = ZEXT3264(_DAT_01feed20);
                      auVar41 = vbroadcastss_avx512vl(ZEXT416(0x3e124925));
                      auVar242 = ZEXT1664(auVar41);
                      auVar88 = vbroadcastss_avx512vl(ZEXT416(0x40400000));
                      auVar241 = ZEXT3264(auVar88);
                      auVar41 = vbroadcastss_avx512vl(ZEXT416(0x80000000));
                      auVar240 = ZEXT1664(auVar41);
                      auVar41 = vbroadcastss_avx512vl(ZEXT416(0x40400000));
                      auVar239 = ZEXT1664(auVar41);
                      auVar41 = vbroadcastss_avx512vl(ZEXT416(0x3f800000));
                      auVar245 = ZEXT1664(auVar41);
                      auVar41 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
                      auVar244 = ZEXT1664(auVar41);
                    }
                    auVar41 = auVar246._0_16_;
                    if (local_420 != (undefined1  [32])0x0) {
                      p_Var9 = context->args->filter;
                      if ((p_Var9 != (RTCFilterFunctionN)0x0) &&
                         (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                           RTC_RAY_QUERY_FLAG_INCOHERENT ||
                          (((pGVar6->field_8).field_0x2 & 0x40) != 0)))) {
                        (*p_Var9)(&local_470);
                        auVar41 = vxorps_avx512vl(auVar41,auVar41);
                        auVar246 = ZEXT1664(auVar41);
                        auVar247 = ZEXT464(0x3f800000);
                        auVar243 = ZEXT3264(_DAT_01feed20);
                        auVar41 = vbroadcastss_avx512vl(ZEXT416(0x3e124925));
                        auVar242 = ZEXT1664(auVar41);
                        auVar88 = vbroadcastss_avx512vl(ZEXT416(0x40400000));
                        auVar241 = ZEXT3264(auVar88);
                        auVar41 = vbroadcastss_avx512vl(ZEXT416(0x80000000));
                        auVar240 = ZEXT1664(auVar41);
                        auVar41 = vbroadcastss_avx512vl(ZEXT416(0x40400000));
                        auVar239 = ZEXT1664(auVar41);
                        auVar41 = vbroadcastss_avx512vl(ZEXT416(0x3f800000));
                        auVar245 = ZEXT1664(auVar41);
                        auVar41 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
                        auVar244 = ZEXT1664(auVar41);
                      }
                      if (local_420 != (undefined1  [32])0x0) {
                        uVar32 = vptestmd_avx512vl(local_420,local_420);
                        iVar19 = *(int *)(local_470.hit + 4);
                        iVar20 = *(int *)(local_470.hit + 8);
                        iVar21 = *(int *)(local_470.hit + 0xc);
                        iVar22 = *(int *)(local_470.hit + 0x10);
                        iVar23 = *(int *)(local_470.hit + 0x14);
                        iVar24 = *(int *)(local_470.hit + 0x18);
                        iVar25 = *(int *)(local_470.hit + 0x1c);
                        bVar26 = (byte)uVar32;
                        bVar37 = (bool)((byte)(uVar32 >> 1) & 1);
                        bVar38 = (bool)((byte)(uVar32 >> 2) & 1);
                        bVar35 = (bool)((byte)(uVar32 >> 3) & 1);
                        bVar36 = (bool)((byte)(uVar32 >> 4) & 1);
                        bVar10 = (bool)((byte)(uVar32 >> 5) & 1);
                        bVar11 = (bool)((byte)(uVar32 >> 6) & 1);
                        bVar12 = SUB81(uVar32 >> 7,0);
                        *(uint *)(local_470.ray + 0x180) =
                             (uint)(bVar26 & 1) * *(int *)local_470.hit |
                             (uint)!(bool)(bVar26 & 1) * *(int *)(local_470.ray + 0x180);
                        *(uint *)(local_470.ray + 0x184) =
                             (uint)bVar37 * iVar19 | (uint)!bVar37 * *(int *)(local_470.ray + 0x184)
                        ;
                        *(uint *)(local_470.ray + 0x188) =
                             (uint)bVar38 * iVar20 | (uint)!bVar38 * *(int *)(local_470.ray + 0x188)
                        ;
                        *(uint *)(local_470.ray + 0x18c) =
                             (uint)bVar35 * iVar21 | (uint)!bVar35 * *(int *)(local_470.ray + 0x18c)
                        ;
                        *(uint *)(local_470.ray + 400) =
                             (uint)bVar36 * iVar22 | (uint)!bVar36 * *(int *)(local_470.ray + 400);
                        *(uint *)(local_470.ray + 0x194) =
                             (uint)bVar10 * iVar23 | (uint)!bVar10 * *(int *)(local_470.ray + 0x194)
                        ;
                        *(uint *)(local_470.ray + 0x198) =
                             (uint)bVar11 * iVar24 | (uint)!bVar11 * *(int *)(local_470.ray + 0x198)
                        ;
                        *(uint *)(local_470.ray + 0x19c) =
                             (uint)bVar12 * iVar25 | (uint)!bVar12 * *(int *)(local_470.ray + 0x19c)
                        ;
                        iVar19 = *(int *)(local_470.hit + 0x24);
                        iVar20 = *(int *)(local_470.hit + 0x28);
                        iVar21 = *(int *)(local_470.hit + 0x2c);
                        iVar22 = *(int *)(local_470.hit + 0x30);
                        iVar23 = *(int *)(local_470.hit + 0x34);
                        iVar24 = *(int *)(local_470.hit + 0x38);
                        iVar25 = *(int *)(local_470.hit + 0x3c);
                        bVar37 = (bool)((byte)(uVar32 >> 1) & 1);
                        bVar38 = (bool)((byte)(uVar32 >> 2) & 1);
                        bVar35 = (bool)((byte)(uVar32 >> 3) & 1);
                        bVar36 = (bool)((byte)(uVar32 >> 4) & 1);
                        bVar10 = (bool)((byte)(uVar32 >> 5) & 1);
                        bVar11 = (bool)((byte)(uVar32 >> 6) & 1);
                        bVar12 = SUB81(uVar32 >> 7,0);
                        *(uint *)(local_470.ray + 0x1a0) =
                             (uint)(bVar26 & 1) * *(int *)(local_470.hit + 0x20) |
                             (uint)!(bool)(bVar26 & 1) * *(int *)(local_470.ray + 0x1a0);
                        *(uint *)(local_470.ray + 0x1a4) =
                             (uint)bVar37 * iVar19 | (uint)!bVar37 * *(int *)(local_470.ray + 0x1a4)
                        ;
                        *(uint *)(local_470.ray + 0x1a8) =
                             (uint)bVar38 * iVar20 | (uint)!bVar38 * *(int *)(local_470.ray + 0x1a8)
                        ;
                        *(uint *)(local_470.ray + 0x1ac) =
                             (uint)bVar35 * iVar21 | (uint)!bVar35 * *(int *)(local_470.ray + 0x1ac)
                        ;
                        *(uint *)(local_470.ray + 0x1b0) =
                             (uint)bVar36 * iVar22 | (uint)!bVar36 * *(int *)(local_470.ray + 0x1b0)
                        ;
                        *(uint *)(local_470.ray + 0x1b4) =
                             (uint)bVar10 * iVar23 | (uint)!bVar10 * *(int *)(local_470.ray + 0x1b4)
                        ;
                        *(uint *)(local_470.ray + 0x1b8) =
                             (uint)bVar11 * iVar24 | (uint)!bVar11 * *(int *)(local_470.ray + 0x1b8)
                        ;
                        *(uint *)(local_470.ray + 0x1bc) =
                             (uint)bVar12 * iVar25 | (uint)!bVar12 * *(int *)(local_470.ray + 0x1bc)
                        ;
                        iVar19 = *(int *)(local_470.hit + 0x44);
                        iVar20 = *(int *)(local_470.hit + 0x48);
                        iVar21 = *(int *)(local_470.hit + 0x4c);
                        iVar22 = *(int *)(local_470.hit + 0x50);
                        iVar23 = *(int *)(local_470.hit + 0x54);
                        iVar24 = *(int *)(local_470.hit + 0x58);
                        iVar25 = *(int *)(local_470.hit + 0x5c);
                        bVar37 = (bool)((byte)(uVar32 >> 1) & 1);
                        bVar38 = (bool)((byte)(uVar32 >> 2) & 1);
                        bVar35 = (bool)((byte)(uVar32 >> 3) & 1);
                        bVar36 = (bool)((byte)(uVar32 >> 4) & 1);
                        bVar10 = (bool)((byte)(uVar32 >> 5) & 1);
                        bVar11 = (bool)((byte)(uVar32 >> 6) & 1);
                        bVar12 = SUB81(uVar32 >> 7,0);
                        *(uint *)(local_470.ray + 0x1c0) =
                             (uint)(bVar26 & 1) * *(int *)(local_470.hit + 0x40) |
                             (uint)!(bool)(bVar26 & 1) * *(int *)(local_470.ray + 0x1c0);
                        *(uint *)(local_470.ray + 0x1c4) =
                             (uint)bVar37 * iVar19 | (uint)!bVar37 * *(int *)(local_470.ray + 0x1c4)
                        ;
                        *(uint *)(local_470.ray + 0x1c8) =
                             (uint)bVar38 * iVar20 | (uint)!bVar38 * *(int *)(local_470.ray + 0x1c8)
                        ;
                        *(uint *)(local_470.ray + 0x1cc) =
                             (uint)bVar35 * iVar21 | (uint)!bVar35 * *(int *)(local_470.ray + 0x1cc)
                        ;
                        *(uint *)(local_470.ray + 0x1d0) =
                             (uint)bVar36 * iVar22 | (uint)!bVar36 * *(int *)(local_470.ray + 0x1d0)
                        ;
                        *(uint *)(local_470.ray + 0x1d4) =
                             (uint)bVar10 * iVar23 | (uint)!bVar10 * *(int *)(local_470.ray + 0x1d4)
                        ;
                        *(uint *)(local_470.ray + 0x1d8) =
                             (uint)bVar11 * iVar24 | (uint)!bVar11 * *(int *)(local_470.ray + 0x1d8)
                        ;
                        *(uint *)(local_470.ray + 0x1dc) =
                             (uint)bVar12 * iVar25 | (uint)!bVar12 * *(int *)(local_470.ray + 0x1dc)
                        ;
                        iVar19 = *(int *)(local_470.hit + 100);
                        iVar20 = *(int *)(local_470.hit + 0x68);
                        iVar21 = *(int *)(local_470.hit + 0x6c);
                        iVar22 = *(int *)(local_470.hit + 0x70);
                        iVar23 = *(int *)(local_470.hit + 0x74);
                        iVar24 = *(int *)(local_470.hit + 0x78);
                        iVar25 = *(int *)(local_470.hit + 0x7c);
                        bVar37 = (bool)((byte)(uVar32 >> 1) & 1);
                        bVar38 = (bool)((byte)(uVar32 >> 2) & 1);
                        bVar35 = (bool)((byte)(uVar32 >> 3) & 1);
                        bVar36 = (bool)((byte)(uVar32 >> 4) & 1);
                        bVar10 = (bool)((byte)(uVar32 >> 5) & 1);
                        bVar11 = (bool)((byte)(uVar32 >> 6) & 1);
                        bVar12 = SUB81(uVar32 >> 7,0);
                        *(uint *)(local_470.ray + 0x1e0) =
                             (uint)(bVar26 & 1) * *(int *)(local_470.hit + 0x60) |
                             (uint)!(bool)(bVar26 & 1) * *(int *)(local_470.ray + 0x1e0);
                        *(uint *)(local_470.ray + 0x1e4) =
                             (uint)bVar37 * iVar19 | (uint)!bVar37 * *(int *)(local_470.ray + 0x1e4)
                        ;
                        *(uint *)(local_470.ray + 0x1e8) =
                             (uint)bVar38 * iVar20 | (uint)!bVar38 * *(int *)(local_470.ray + 0x1e8)
                        ;
                        *(uint *)(local_470.ray + 0x1ec) =
                             (uint)bVar35 * iVar21 | (uint)!bVar35 * *(int *)(local_470.ray + 0x1ec)
                        ;
                        *(uint *)(local_470.ray + 0x1f0) =
                             (uint)bVar36 * iVar22 | (uint)!bVar36 * *(int *)(local_470.ray + 0x1f0)
                        ;
                        *(uint *)(local_470.ray + 500) =
                             (uint)bVar10 * iVar23 | (uint)!bVar10 * *(int *)(local_470.ray + 500);
                        *(uint *)(local_470.ray + 0x1f8) =
                             (uint)bVar11 * iVar24 | (uint)!bVar11 * *(int *)(local_470.ray + 0x1f8)
                        ;
                        *(uint *)(local_470.ray + 0x1fc) =
                             (uint)bVar12 * iVar25 | (uint)!bVar12 * *(int *)(local_470.ray + 0x1fc)
                        ;
                        iVar19 = *(int *)(local_470.hit + 0x84);
                        iVar20 = *(int *)(local_470.hit + 0x88);
                        iVar21 = *(int *)(local_470.hit + 0x8c);
                        iVar22 = *(int *)(local_470.hit + 0x90);
                        iVar23 = *(int *)(local_470.hit + 0x94);
                        iVar24 = *(int *)(local_470.hit + 0x98);
                        iVar25 = *(int *)(local_470.hit + 0x9c);
                        bVar37 = (bool)((byte)(uVar32 >> 1) & 1);
                        bVar38 = (bool)((byte)(uVar32 >> 2) & 1);
                        bVar35 = (bool)((byte)(uVar32 >> 3) & 1);
                        bVar36 = (bool)((byte)(uVar32 >> 4) & 1);
                        bVar10 = (bool)((byte)(uVar32 >> 5) & 1);
                        bVar11 = (bool)((byte)(uVar32 >> 6) & 1);
                        bVar12 = SUB81(uVar32 >> 7,0);
                        *(uint *)(local_470.ray + 0x200) =
                             (uint)(bVar26 & 1) * *(int *)(local_470.hit + 0x80) |
                             (uint)!(bool)(bVar26 & 1) * *(int *)(local_470.ray + 0x200);
                        *(uint *)(local_470.ray + 0x204) =
                             (uint)bVar37 * iVar19 | (uint)!bVar37 * *(int *)(local_470.ray + 0x204)
                        ;
                        *(uint *)(local_470.ray + 0x208) =
                             (uint)bVar38 * iVar20 | (uint)!bVar38 * *(int *)(local_470.ray + 0x208)
                        ;
                        *(uint *)(local_470.ray + 0x20c) =
                             (uint)bVar35 * iVar21 | (uint)!bVar35 * *(int *)(local_470.ray + 0x20c)
                        ;
                        *(uint *)(local_470.ray + 0x210) =
                             (uint)bVar36 * iVar22 | (uint)!bVar36 * *(int *)(local_470.ray + 0x210)
                        ;
                        *(uint *)(local_470.ray + 0x214) =
                             (uint)bVar10 * iVar23 | (uint)!bVar10 * *(int *)(local_470.ray + 0x214)
                        ;
                        *(uint *)(local_470.ray + 0x218) =
                             (uint)bVar11 * iVar24 | (uint)!bVar11 * *(int *)(local_470.ray + 0x218)
                        ;
                        *(uint *)(local_470.ray + 0x21c) =
                             (uint)bVar12 * iVar25 | (uint)!bVar12 * *(int *)(local_470.ray + 0x21c)
                        ;
                        auVar88 = vmovdqu32_avx512vl(*(undefined1 (*) [32])(local_470.hit + 0xa0));
                        *(undefined1 (*) [32])(local_470.ray + 0x220) = auVar88;
                        auVar88 = vmovdqu32_avx512vl(*(undefined1 (*) [32])(local_470.hit + 0xc0));
                        *(undefined1 (*) [32])(local_470.ray + 0x240) = auVar88;
                        auVar88 = vmovdqa32_avx512vl(*(undefined1 (*) [32])(local_470.hit + 0xe0));
                        *(undefined1 (*) [32])(local_470.ray + 0x260) = auVar88;
                        auVar88 = vmovdqa32_avx512vl(*(undefined1 (*) [32])(local_470.hit + 0x100));
                        *(undefined1 (*) [32])(local_470.ray + 0x280) = auVar88;
                        break;
                      }
                    }
                    *(float *)(ray + k * 4 + 0x100) = fVar221;
                    break;
                  }
                  lVar30 = lVar30 + -1;
                } while (lVar30 != 0);
              }
            }
          }
          if (uVar27 == 0) break;
        } while( true );
      }
      uVar110 = *(undefined4 *)(ray + k * 4 + 0x100);
      auVar18._4_4_ = uVar110;
      auVar18._0_4_ = uVar110;
      auVar18._8_4_ = uVar110;
      auVar18._12_4_ = uVar110;
      uVar13 = vcmpps_avx512vl(local_3f0,auVar18,2);
      uVar34 = (uint)uVar39 & local_478 & (uint)uVar13;
      uVar39 = (ulong)uVar34;
    } while (uVar34 != 0);
  }
  return;
}

Assistant:

static __forceinline void intersect_hn(Precalculations& pre, RayHitK<K>& ray, const size_t k, RayQueryContext* context, const Primitive& prim)
      {
        vfloat<M> tNear;
        vbool<M> valid = intersect(ray,k,prim,tNear);

        const size_t N = prim.N;
        size_t mask = movemask(valid);
        while (mask)
        {
          const size_t i = bscf(mask);
          STAT3(normal.trav_prims,1,1,1);
          const unsigned int geomID = prim.geomID(N);
          const unsigned int primID = prim.primID(N)[i];
          const CurveGeometry* geom = context->scene->get<CurveGeometry>(geomID);
          Vec3ff p0,t0,p1,t1; Vec3fa n0,dn0,n1,dn1; geom->gather_hermite(p0,t0,n0,dn0,p1,t1,n1,dn1,geom->curve(primID));
          Intersector().intersect(pre,ray,k,context,geom,primID,p0,t0,p1,t1,n0,dn0,n1,dn1,Epilog(ray,k,context,geomID,primID));
          mask &= movemask(tNear <= vfloat<M>(ray.tfar[k]));
        }
      }